

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O1

bool embree::avx512::CurveNiIntersector1<8>::
     occluded_n<embree::avx512::OrientedCurve1Intersector1<embree::BezierCurveT,7,8>,embree::avx512::Occluded1Epilog1<true>>
               (Precalculations *pre,Ray *ray,RayQueryContext *context,Primitive *prim)

{
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar1;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar2;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar3;
  Primitive PVar4;
  uint uVar5;
  Geometry *pGVar6;
  RTCFilterFunctionN p_Var7;
  void *pvVar8;
  __int_type_conflict _Var9;
  bool bVar10;
  undefined8 uVar11;
  bool bVar12;
  undefined8 uVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  byte bVar23;
  uint uVar24;
  ulong uVar25;
  uint uVar27;
  long lVar28;
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  ulong uVar29;
  uint uVar30;
  ulong uVar31;
  bool bVar32;
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar61 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar78 [32];
  undefined1 auVar44 [16];
  undefined1 auVar80 [32];
  undefined1 auVar82 [32];
  undefined1 auVar84 [32];
  undefined1 auVar86 [32];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar88 [32];
  int iVar89;
  float t1;
  undefined4 uVar90;
  float fVar92;
  undefined1 auVar91 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  float fVar102;
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  float fVar111;
  float fVar121;
  float fVar122;
  float fVar123;
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  vfloat4 b0;
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [32];
  undefined1 auVar132 [32];
  undefined1 in_ZMM4 [64];
  vfloat4 b0_1;
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [32];
  undefined1 auVar149 [32];
  vfloat4 a0_3;
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [32];
  vfloat4 a0_2;
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [32];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [32];
  undefined1 auVar181 [32];
  undefined1 auVar182 [32];
  float fVar193;
  float fVar194;
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  float fVar195;
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  float fVar196;
  float fVar197;
  float fVar198;
  float fVar199;
  float fVar208;
  float fVar209;
  vfloat4 a0_1;
  float fVar210;
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  float fVar211;
  float fVar218;
  float fVar219;
  vfloat4 a0;
  undefined1 auVar212 [16];
  float fVar220;
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  undefined1 auVar231 [64];
  undefined1 auVar232 [64];
  undefined1 auVar233 [64];
  undefined1 auVar234 [64];
  undefined1 auVar235 [64];
  undefined1 auVar236 [64];
  undefined1 auVar237 [64];
  undefined1 auVar238 [64];
  undefined1 auVar239 [64];
  undefined1 auVar240 [64];
  undefined1 auVar241 [64];
  undefined1 auVar242 [64];
  undefined1 auVar243 [64];
  RTCFilterFunctionNArguments args;
  uint mask_stack [4];
  BBox1f cu_stack [4];
  BBox1f cv_stack [4];
  bool local_36d;
  int local_34c;
  undefined1 local_348 [16];
  undefined1 local_338 [16];
  ulong local_320;
  undefined1 local_318 [16];
  undefined1 local_308 [16];
  undefined1 local_2f8 [16];
  undefined1 local_2e8 [16];
  ulong local_2d8;
  Primitive *local_2d0;
  RTCFilterFunctionNArguments local_2c8;
  undefined1 local_298 [16];
  undefined1 local_288 [8];
  float fStack_280;
  float fStack_27c;
  undefined1 local_278 [8];
  float fStack_270;
  float fStack_26c;
  undefined1 local_268 [16];
  undefined1 local_258 [16];
  undefined1 local_248 [8];
  float fStack_240;
  float fStack_23c;
  undefined1 local_238 [16];
  undefined1 local_228 [8];
  float fStack_220;
  float fStack_21c;
  undefined1 local_218 [16];
  undefined1 local_208 [16];
  undefined1 local_1f8 [8];
  float fStack_1f0;
  float fStack_1ec;
  undefined1 local_1e8 [8];
  float fStack_1e0;
  float fStack_1dc;
  undefined1 local_1d8 [8];
  float fStack_1d0;
  float fStack_1cc;
  undefined1 local_1c8 [8];
  float fStack_1c0;
  float fStack_1bc;
  undefined1 local_1b8 [8];
  float fStack_1b0;
  float fStack_1ac;
  undefined1 local_1a8 [16];
  undefined1 local_198 [16];
  undefined1 local_188 [16];
  undefined1 local_178 [16];
  uint auStack_168 [4];
  undefined8 local_158;
  undefined4 local_150;
  undefined8 local_14c;
  undefined4 local_144;
  undefined4 local_140;
  uint local_13c;
  uint local_138;
  undefined1 local_128 [8];
  float fStack_120;
  float fStack_11c;
  undefined1 local_118 [16];
  undefined1 local_108 [16];
  undefined1 local_f8 [16];
  undefined1 local_e8 [16];
  uint uStack_d8;
  float afStack_d4 [7];
  undefined1 local_b8 [32];
  undefined1 local_98 [32];
  undefined1 local_78 [32];
  ulong auStack_58 [5];
  ulong uVar26;
  undefined1 auVar60 [32];
  undefined1 auVar62 [32];
  undefined1 auVar77 [32];
  undefined1 auVar79 [32];
  undefined1 auVar81 [32];
  undefined1 auVar83 [32];
  undefined1 auVar85 [32];
  undefined1 auVar87 [32];
  undefined1 auVar224 [32];
  
  PVar4 = prim[1];
  uVar25 = (ulong)(byte)PVar4;
  fVar198 = *(float *)(prim + uVar25 * 0x19 + 0x12);
  auVar35 = vsubps_avx((undefined1  [16])(ray->org).field_0,
                       *(undefined1 (*) [16])(prim + uVar25 * 0x19 + 6));
  fVar102 = fVar198 * (ray->dir).field_0.m128[0];
  fVar111 = fVar198 * auVar35._0_4_;
  auVar33._8_8_ = 0;
  auVar33._0_8_ = *(ulong *)(prim + uVar25 * 4 + 6);
  auVar58 = vpmovsxbd_avx2(auVar33);
  auVar58 = vcvtdq2ps_avx(auVar58);
  auVar43._8_8_ = 0;
  auVar43._0_8_ = *(ulong *)(prim + uVar25 * 5 + 6);
  auVar57 = vpmovsxbd_avx2(auVar43);
  auVar57 = vcvtdq2ps_avx(auVar57);
  auVar42._8_8_ = 0;
  auVar42._0_8_ = *(ulong *)(prim + uVar25 * 6 + 6);
  auVar63 = vpmovsxbd_avx2(auVar42);
  auVar63 = vcvtdq2ps_avx(auVar63);
  auVar41._8_8_ = 0;
  auVar41._0_8_ = *(ulong *)(prim + uVar25 * 0xb + 6);
  auVar71 = vpmovsxbd_avx2(auVar41);
  auVar71 = vcvtdq2ps_avx(auVar71);
  auVar40._8_8_ = 0;
  auVar40._0_8_ = *(ulong *)(prim + (ulong)((uint)(byte)PVar4 * 0xc) + 6);
  auVar72 = vpmovsxbd_avx2(auVar40);
  auVar72 = vcvtdq2ps_avx(auVar72);
  auVar39._8_8_ = 0;
  auVar39._0_8_ = *(ulong *)(prim + (uint)(byte)PVar4 * 0xc + uVar25 + 6);
  auVar64 = vpmovsxbd_avx2(auVar39);
  auVar64 = vcvtdq2ps_avx(auVar64);
  uVar31 = (ulong)(uint)((int)(uVar25 * 9) * 2);
  auVar38._8_8_ = 0;
  auVar38._0_8_ = *(ulong *)(prim + uVar31 + 6);
  auVar65 = vpmovsxbd_avx2(auVar38);
  auVar37._8_8_ = 0;
  auVar37._0_8_ = *(ulong *)(prim + uVar31 + uVar25 + 6);
  auVar55 = vpmovsxbd_avx2(auVar37);
  auVar65 = vcvtdq2ps_avx(auVar65);
  auVar66 = vcvtdq2ps_avx(auVar55);
  uVar29 = (ulong)(uint)((int)(uVar25 * 5) << 2);
  auVar34._8_8_ = 0;
  auVar34._0_8_ = *(ulong *)(prim + uVar29 + 6);
  auVar67 = vpmovsxbd_avx2(auVar34);
  auVar67 = vcvtdq2ps_avx(auVar67);
  auVar118._4_4_ = fVar102;
  auVar118._0_4_ = fVar102;
  auVar118._8_4_ = fVar102;
  auVar118._12_4_ = fVar102;
  auVar118._16_4_ = fVar102;
  auVar118._20_4_ = fVar102;
  auVar118._24_4_ = fVar102;
  auVar118._28_4_ = fVar102;
  auVar51 = vbroadcastss_avx512vl(ZEXT416(1));
  auVar232 = ZEXT3264(auVar51);
  auVar56 = ZEXT1632(CONCAT412(fVar198 * (ray->dir).field_0.m128[3],
                               CONCAT48(fVar198 * (ray->dir).field_0.m128[2],
                                        CONCAT44(fVar198 * (ray->dir).field_0.m128[1],fVar102))));
  auVar52 = vpermps_avx512vl(auVar51,auVar56);
  auVar53 = vbroadcastss_avx512vl(ZEXT416(2));
  auVar239 = ZEXT3264(auVar53);
  auVar54 = vpermps_avx512vl(auVar53,auVar56);
  fVar102 = auVar54._0_4_;
  auVar233._0_4_ = fVar102 * auVar63._0_4_;
  fVar193 = auVar54._4_4_;
  auVar233._4_4_ = fVar193 * auVar63._4_4_;
  fVar194 = auVar54._8_4_;
  auVar233._8_4_ = fVar194 * auVar63._8_4_;
  fVar195 = auVar54._12_4_;
  auVar233._12_4_ = fVar195 * auVar63._12_4_;
  fVar196 = auVar54._16_4_;
  auVar233._16_4_ = fVar196 * auVar63._16_4_;
  fVar197 = auVar54._20_4_;
  auVar233._20_4_ = fVar197 * auVar63._20_4_;
  fVar92 = auVar54._24_4_;
  auVar233._28_36_ = in_ZMM4._28_36_;
  auVar233._24_4_ = fVar92 * auVar63._24_4_;
  auVar56._4_4_ = auVar64._4_4_ * fVar193;
  auVar56._0_4_ = auVar64._0_4_ * fVar102;
  auVar56._8_4_ = auVar64._8_4_ * fVar194;
  auVar56._12_4_ = auVar64._12_4_ * fVar195;
  auVar56._16_4_ = auVar64._16_4_ * fVar196;
  auVar56._20_4_ = auVar64._20_4_ * fVar197;
  auVar56._24_4_ = auVar64._24_4_ * fVar92;
  auVar56._28_4_ = auVar55._28_4_;
  auVar55._4_4_ = auVar67._4_4_ * fVar193;
  auVar55._0_4_ = auVar67._0_4_ * fVar102;
  auVar55._8_4_ = auVar67._8_4_ * fVar194;
  auVar55._12_4_ = auVar67._12_4_ * fVar195;
  auVar55._16_4_ = auVar67._16_4_ * fVar196;
  auVar55._20_4_ = auVar67._20_4_ * fVar197;
  auVar55._24_4_ = auVar67._24_4_ * fVar92;
  auVar55._28_4_ = auVar54._28_4_;
  auVar33 = vfmadd231ps_fma(auVar233._0_32_,auVar52,auVar57);
  auVar43 = vfmadd231ps_fma(auVar56,auVar52,auVar72);
  auVar42 = vfmadd231ps_fma(auVar55,auVar66,auVar52);
  auVar33 = vfmadd231ps_fma(ZEXT1632(auVar33),auVar118,auVar58);
  auVar43 = vfmadd231ps_fma(ZEXT1632(auVar43),auVar118,auVar71);
  auVar42 = vfmadd231ps_fma(ZEXT1632(auVar42),auVar65,auVar118);
  auVar131._4_4_ = fVar111;
  auVar131._0_4_ = fVar111;
  auVar131._8_4_ = fVar111;
  auVar131._12_4_ = fVar111;
  auVar131._16_4_ = fVar111;
  auVar131._20_4_ = fVar111;
  auVar131._24_4_ = fVar111;
  auVar131._28_4_ = fVar111;
  auVar56 = ZEXT1632(CONCAT412(fVar198 * auVar35._12_4_,
                               CONCAT48(fVar198 * auVar35._8_4_,
                                        CONCAT44(fVar198 * auVar35._4_4_,fVar111))));
  auVar55 = vpermps_avx512vl(auVar51,auVar56);
  auVar56 = vpermps_avx512vl(auVar53,auVar56);
  fVar198 = auVar56._0_4_;
  fVar102 = auVar56._4_4_;
  auVar51._4_4_ = fVar102 * auVar63._4_4_;
  auVar51._0_4_ = fVar198 * auVar63._0_4_;
  fVar193 = auVar56._8_4_;
  auVar51._8_4_ = fVar193 * auVar63._8_4_;
  fVar194 = auVar56._12_4_;
  auVar51._12_4_ = fVar194 * auVar63._12_4_;
  fVar195 = auVar56._16_4_;
  auVar51._16_4_ = fVar195 * auVar63._16_4_;
  fVar196 = auVar56._20_4_;
  auVar51._20_4_ = fVar196 * auVar63._20_4_;
  fVar197 = auVar56._24_4_;
  auVar51._24_4_ = fVar197 * auVar63._24_4_;
  auVar51._28_4_ = auVar63._28_4_;
  auVar69._0_4_ = auVar64._0_4_ * fVar198;
  auVar69._4_4_ = auVar64._4_4_ * fVar102;
  auVar69._8_4_ = auVar64._8_4_ * fVar193;
  auVar69._12_4_ = auVar64._12_4_ * fVar194;
  auVar69._16_4_ = auVar64._16_4_ * fVar195;
  auVar69._20_4_ = auVar64._20_4_ * fVar196;
  auVar69._24_4_ = auVar64._24_4_ * fVar197;
  auVar69._28_4_ = 0;
  auVar64._4_4_ = auVar67._4_4_ * fVar102;
  auVar64._0_4_ = auVar67._0_4_ * fVar198;
  auVar64._8_4_ = auVar67._8_4_ * fVar193;
  auVar64._12_4_ = auVar67._12_4_ * fVar194;
  auVar64._16_4_ = auVar67._16_4_ * fVar195;
  auVar64._20_4_ = auVar67._20_4_ * fVar196;
  auVar64._24_4_ = auVar67._24_4_ * fVar197;
  auVar64._28_4_ = auVar56._28_4_;
  auVar41 = vfmadd231ps_fma(auVar51,auVar55,auVar57);
  auVar40 = vfmadd231ps_fma(auVar69,auVar55,auVar72);
  auVar39 = vfmadd231ps_fma(auVar64,auVar55,auVar66);
  auVar41 = vfmadd231ps_fma(ZEXT1632(auVar41),auVar131,auVar58);
  auVar40 = vfmadd231ps_fma(ZEXT1632(auVar40),auVar131,auVar71);
  auVar39 = vfmadd231ps_fma(ZEXT1632(auVar39),auVar131,auVar65);
  auVar73._8_4_ = 0x7fffffff;
  auVar73._0_8_ = 0x7fffffff7fffffff;
  auVar73._12_4_ = 0x7fffffff;
  auVar73._16_4_ = 0x7fffffff;
  auVar73._20_4_ = 0x7fffffff;
  auVar73._24_4_ = 0x7fffffff;
  auVar73._28_4_ = 0x7fffffff;
  auVar58 = vandps_avx(ZEXT1632(auVar33),auVar73);
  auVar75._8_4_ = 0x219392ef;
  auVar75._0_8_ = 0x219392ef219392ef;
  auVar75._12_4_ = 0x219392ef;
  auVar75._16_4_ = 0x219392ef;
  auVar75._20_4_ = 0x219392ef;
  auVar75._24_4_ = 0x219392ef;
  auVar75._28_4_ = 0x219392ef;
  uVar31 = vcmpps_avx512vl(auVar58,auVar75,1);
  bVar32 = (bool)((byte)uVar31 & 1);
  auVar52._0_4_ = (uint)bVar32 * 0x219392ef | (uint)!bVar32 * auVar33._0_4_;
  bVar32 = (bool)((byte)(uVar31 >> 1) & 1);
  auVar52._4_4_ = (uint)bVar32 * 0x219392ef | (uint)!bVar32 * auVar33._4_4_;
  bVar32 = (bool)((byte)(uVar31 >> 2) & 1);
  auVar52._8_4_ = (uint)bVar32 * 0x219392ef | (uint)!bVar32 * auVar33._8_4_;
  bVar32 = (bool)((byte)(uVar31 >> 3) & 1);
  auVar52._12_4_ = (uint)bVar32 * 0x219392ef | (uint)!bVar32 * auVar33._12_4_;
  auVar52._16_4_ = (uint)((byte)(uVar31 >> 4) & 1) * 0x219392ef;
  auVar52._20_4_ = (uint)((byte)(uVar31 >> 5) & 1) * 0x219392ef;
  auVar52._24_4_ = (uint)((byte)(uVar31 >> 6) & 1) * 0x219392ef;
  auVar52._28_4_ = (uint)(byte)(uVar31 >> 7) * 0x219392ef;
  auVar58 = vandps_avx(ZEXT1632(auVar43),auVar73);
  uVar31 = vcmpps_avx512vl(auVar58,auVar75,1);
  bVar32 = (bool)((byte)uVar31 & 1);
  auVar53._0_4_ = (uint)bVar32 * 0x219392ef | (uint)!bVar32 * auVar43._0_4_;
  bVar32 = (bool)((byte)(uVar31 >> 1) & 1);
  auVar53._4_4_ = (uint)bVar32 * 0x219392ef | (uint)!bVar32 * auVar43._4_4_;
  bVar32 = (bool)((byte)(uVar31 >> 2) & 1);
  auVar53._8_4_ = (uint)bVar32 * 0x219392ef | (uint)!bVar32 * auVar43._8_4_;
  bVar32 = (bool)((byte)(uVar31 >> 3) & 1);
  auVar53._12_4_ = (uint)bVar32 * 0x219392ef | (uint)!bVar32 * auVar43._12_4_;
  auVar53._16_4_ = (uint)((byte)(uVar31 >> 4) & 1) * 0x219392ef;
  auVar53._20_4_ = (uint)((byte)(uVar31 >> 5) & 1) * 0x219392ef;
  auVar53._24_4_ = (uint)((byte)(uVar31 >> 6) & 1) * 0x219392ef;
  auVar53._28_4_ = (uint)(byte)(uVar31 >> 7) * 0x219392ef;
  auVar58 = vandps_avx(ZEXT1632(auVar42),auVar73);
  uVar31 = vcmpps_avx512vl(auVar58,auVar75,1);
  bVar32 = (bool)((byte)uVar31 & 1);
  auVar58._0_4_ = (uint)bVar32 * 0x219392ef | (uint)!bVar32 * auVar42._0_4_;
  bVar32 = (bool)((byte)(uVar31 >> 1) & 1);
  auVar58._4_4_ = (uint)bVar32 * 0x219392ef | (uint)!bVar32 * auVar42._4_4_;
  bVar32 = (bool)((byte)(uVar31 >> 2) & 1);
  auVar58._8_4_ = (uint)bVar32 * 0x219392ef | (uint)!bVar32 * auVar42._8_4_;
  bVar32 = (bool)((byte)(uVar31 >> 3) & 1);
  auVar58._12_4_ = (uint)bVar32 * 0x219392ef | (uint)!bVar32 * auVar42._12_4_;
  auVar58._16_4_ = (uint)((byte)(uVar31 >> 4) & 1) * 0x219392ef;
  auVar58._20_4_ = (uint)((byte)(uVar31 >> 5) & 1) * 0x219392ef;
  auVar58._24_4_ = (uint)((byte)(uVar31 >> 6) & 1) * 0x219392ef;
  auVar58._28_4_ = (uint)(byte)(uVar31 >> 7) * 0x219392ef;
  auVar57 = vrcp14ps_avx512vl(auVar52);
  auVar74._8_4_ = 0x3f800000;
  auVar74._0_8_ = &DAT_3f8000003f800000;
  auVar74._12_4_ = 0x3f800000;
  auVar74._16_4_ = 0x3f800000;
  auVar74._20_4_ = 0x3f800000;
  auVar74._24_4_ = 0x3f800000;
  auVar74._28_4_ = 0x3f800000;
  auVar33 = vfnmadd213ps_fma(auVar52,auVar57,auVar74);
  auVar33 = vfmadd132ps_fma(ZEXT1632(auVar33),auVar57,auVar57);
  auVar57 = vrcp14ps_avx512vl(auVar53);
  auVar43 = vfnmadd213ps_fma(auVar53,auVar57,auVar74);
  auVar43 = vfmadd132ps_fma(ZEXT1632(auVar43),auVar57,auVar57);
  auVar57 = vrcp14ps_avx512vl(auVar58);
  auVar42 = vfnmadd213ps_fma(auVar58,auVar57,auVar74);
  auVar42 = vfmadd132ps_fma(ZEXT1632(auVar42),auVar57,auVar57);
  auVar58 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar25 * 7 + 6));
  auVar58 = vcvtdq2ps_avx(auVar58);
  auVar58 = vsubps_avx(auVar58,ZEXT1632(auVar41));
  auVar57 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar25 * 9 + 6));
  auVar65._4_4_ = auVar33._4_4_ * auVar58._4_4_;
  auVar65._0_4_ = auVar33._0_4_ * auVar58._0_4_;
  auVar65._8_4_ = auVar33._8_4_ * auVar58._8_4_;
  auVar65._12_4_ = auVar33._12_4_ * auVar58._12_4_;
  auVar65._16_4_ = auVar58._16_4_ * 0.0;
  auVar65._20_4_ = auVar58._20_4_ * 0.0;
  auVar65._24_4_ = auVar58._24_4_ * 0.0;
  auVar65._28_4_ = auVar58._28_4_;
  auVar58 = vcvtdq2ps_avx(auVar57);
  auVar58 = vsubps_avx(auVar58,ZEXT1632(auVar41));
  auVar70._0_4_ = auVar33._0_4_ * auVar58._0_4_;
  auVar70._4_4_ = auVar33._4_4_ * auVar58._4_4_;
  auVar70._8_4_ = auVar33._8_4_ * auVar58._8_4_;
  auVar70._12_4_ = auVar33._12_4_ * auVar58._12_4_;
  auVar70._16_4_ = auVar58._16_4_ * 0.0;
  auVar70._20_4_ = auVar58._20_4_ * 0.0;
  auVar70._24_4_ = auVar58._24_4_ * 0.0;
  auVar70._28_4_ = 0;
  auVar57 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + (ulong)(byte)PVar4 * 0x10 + 6));
  auVar58 = vpmovsxwd_avx2(*(undefined1 (*) [16])
                            (prim + (ulong)(byte)PVar4 * 0x10 + uVar25 * -2 + 6));
  auVar58 = vcvtdq2ps_avx(auVar58);
  auVar58 = vsubps_avx(auVar58,ZEXT1632(auVar40));
  auVar66._4_4_ = auVar43._4_4_ * auVar58._4_4_;
  auVar66._0_4_ = auVar43._0_4_ * auVar58._0_4_;
  auVar66._8_4_ = auVar43._8_4_ * auVar58._8_4_;
  auVar66._12_4_ = auVar43._12_4_ * auVar58._12_4_;
  auVar66._16_4_ = auVar58._16_4_ * 0.0;
  auVar66._20_4_ = auVar58._20_4_ * 0.0;
  auVar66._24_4_ = auVar58._24_4_ * 0.0;
  auVar66._28_4_ = auVar58._28_4_;
  auVar58 = vcvtdq2ps_avx(auVar57);
  auVar58 = vsubps_avx(auVar58,ZEXT1632(auVar40));
  auVar68._0_4_ = auVar43._0_4_ * auVar58._0_4_;
  auVar68._4_4_ = auVar43._4_4_ * auVar58._4_4_;
  auVar68._8_4_ = auVar43._8_4_ * auVar58._8_4_;
  auVar68._12_4_ = auVar43._12_4_ * auVar58._12_4_;
  auVar68._16_4_ = auVar58._16_4_ * 0.0;
  auVar68._20_4_ = auVar58._20_4_ * 0.0;
  auVar68._24_4_ = auVar58._24_4_ * 0.0;
  auVar68._28_4_ = 0;
  auVar58 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar29 + uVar25 + 6));
  auVar58 = vcvtdq2ps_avx(auVar58);
  auVar58 = vsubps_avx(auVar58,ZEXT1632(auVar39));
  auVar67._4_4_ = auVar58._4_4_ * auVar42._4_4_;
  auVar67._0_4_ = auVar58._0_4_ * auVar42._0_4_;
  auVar67._8_4_ = auVar58._8_4_ * auVar42._8_4_;
  auVar67._12_4_ = auVar58._12_4_ * auVar42._12_4_;
  auVar67._16_4_ = auVar58._16_4_ * 0.0;
  auVar67._20_4_ = auVar58._20_4_ * 0.0;
  auVar67._24_4_ = auVar58._24_4_ * 0.0;
  auVar67._28_4_ = auVar58._28_4_;
  auVar58 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar25 * 0x17 + 6));
  auVar58 = vcvtdq2ps_avx(auVar58);
  auVar58 = vsubps_avx(auVar58,ZEXT1632(auVar39));
  auVar54._0_4_ = auVar42._0_4_ * auVar58._0_4_;
  auVar54._4_4_ = auVar42._4_4_ * auVar58._4_4_;
  auVar54._8_4_ = auVar42._8_4_ * auVar58._8_4_;
  auVar54._12_4_ = auVar42._12_4_ * auVar58._12_4_;
  auVar54._16_4_ = auVar58._16_4_ * 0.0;
  auVar54._20_4_ = auVar58._20_4_ * 0.0;
  auVar54._24_4_ = auVar58._24_4_ * 0.0;
  auVar54._28_4_ = 0;
  auVar58 = vpminsd_avx2(auVar65,auVar70);
  auVar57 = vpminsd_avx2(auVar66,auVar68);
  auVar58 = vmaxps_avx(auVar58,auVar57);
  auVar57 = vpminsd_avx2(auVar67,auVar54);
  uVar90 = *(undefined4 *)((long)&(ray->org).field_0 + 0xc);
  auVar63._4_4_ = uVar90;
  auVar63._0_4_ = uVar90;
  auVar63._8_4_ = uVar90;
  auVar63._12_4_ = uVar90;
  auVar63._16_4_ = uVar90;
  auVar63._20_4_ = uVar90;
  auVar63._24_4_ = uVar90;
  auVar63._28_4_ = uVar90;
  auVar57 = vmaxps_avx512vl(auVar57,auVar63);
  auVar58 = vmaxps_avx(auVar58,auVar57);
  auVar57._8_4_ = 0x3f7ffffa;
  auVar57._0_8_ = 0x3f7ffffa3f7ffffa;
  auVar57._12_4_ = 0x3f7ffffa;
  auVar57._16_4_ = 0x3f7ffffa;
  auVar57._20_4_ = 0x3f7ffffa;
  auVar57._24_4_ = 0x3f7ffffa;
  auVar57._28_4_ = 0x3f7ffffa;
  local_b8 = vmulps_avx512vl(auVar58,auVar57);
  auVar58 = vpmaxsd_avx2(auVar65,auVar70);
  auVar57 = vpmaxsd_avx2(auVar66,auVar68);
  auVar58 = vminps_avx(auVar58,auVar57);
  auVar57 = vpmaxsd_avx2(auVar67,auVar54);
  fVar198 = ray->tfar;
  auVar71._4_4_ = fVar198;
  auVar71._0_4_ = fVar198;
  auVar71._8_4_ = fVar198;
  auVar71._12_4_ = fVar198;
  auVar71._16_4_ = fVar198;
  auVar71._20_4_ = fVar198;
  auVar71._24_4_ = fVar198;
  auVar71._28_4_ = fVar198;
  auVar57 = vminps_avx512vl(auVar57,auVar71);
  auVar58 = vminps_avx(auVar58,auVar57);
  auVar72._8_4_ = 0x3f800003;
  auVar72._0_8_ = 0x3f8000033f800003;
  auVar72._12_4_ = 0x3f800003;
  auVar72._16_4_ = 0x3f800003;
  auVar72._20_4_ = 0x3f800003;
  auVar72._24_4_ = 0x3f800003;
  auVar72._28_4_ = 0x3f800003;
  auVar58 = vmulps_avx512vl(auVar58,auVar72);
  auVar57 = vpbroadcastd_avx512vl();
  uVar13 = vpcmpgtd_avx512vl(auVar57,_DAT_0205a920);
  uVar11 = vcmpps_avx512vl(local_b8,auVar58,2);
  bVar32 = (byte)((byte)uVar11 & (byte)uVar13) == 0;
  local_36d = !bVar32;
  if (bVar32) {
    return local_36d;
  }
  uVar31 = (ulong)(byte)((byte)uVar11 & (byte)uVar13);
  auVar88._16_16_ = auVar57._16_16_;
  auVar33 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
  auVar242 = ZEXT1664(auVar33);
  auVar33 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
  auVar233 = ZEXT1664(auVar33);
  auVar88._0_16_ = vbroadcastss_avx512vl(ZEXT416(0x80000000));
  auVar234 = ZEXT1664(auVar88._0_16_);
  local_2d0 = prim;
LAB_01d29b40:
  lVar28 = 0;
  for (uVar25 = uVar31; (uVar25 & 1) == 0; uVar25 = uVar25 >> 1 | 0x8000000000000000) {
    lVar28 = lVar28 + 1;
  }
  local_320 = (ulong)*(uint *)(local_2d0 + 2);
  local_2d8 = (ulong)*(uint *)(local_2d0 + lVar28 * 4 + 6);
  pGVar6 = (context->scene->geometries).items[local_320].ptr;
  uVar25 = (ulong)*(uint *)(*(long *)&pGVar6->field_0x58 +
                           pGVar6[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i * local_2d8);
  p_Var7 = pGVar6[1].intersectionFilterN;
  pvVar8 = pGVar6[2].userPtr;
  _Var9 = pGVar6[2].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  auVar33 = *(undefined1 (*) [16])(_Var9 + uVar25 * (long)pvVar8);
  auVar43 = *(undefined1 (*) [16])(_Var9 + (uVar25 + 1) * (long)pvVar8);
  auVar42 = *(undefined1 (*) [16])(_Var9 + (uVar25 + 2) * (long)pvVar8);
  auVar41 = *(undefined1 (*) [16])(_Var9 + (long)pvVar8 * (uVar25 + 3));
  lVar28 = *(long *)&pGVar6[1].time_range.upper;
  auVar40 = *(undefined1 (*) [16])(lVar28 + (long)p_Var7 * uVar25);
  auVar39 = *(undefined1 (*) [16])(lVar28 + (long)p_Var7 * (uVar25 + 1));
  auVar38 = *(undefined1 (*) [16])(lVar28 + (long)p_Var7 * (uVar25 + 2));
  uVar31 = uVar31 - 1 & uVar31;
  auVar37 = *(undefined1 (*) [16])(lVar28 + (long)p_Var7 * (uVar25 + 3));
  if (uVar31 != 0) {
    uVar29 = uVar31 - 1 & uVar31;
    for (uVar25 = uVar31; (uVar25 & 1) == 0; uVar25 = uVar25 >> 1 | 0x8000000000000000) {
    }
    if (uVar29 != 0) {
      for (; (uVar29 & 1) == 0; uVar29 = uVar29 >> 1 | 0x8000000000000000) {
      }
    }
  }
  auVar60._16_16_ = auVar88._16_16_;
  auVar60._0_16_ = vxorps_avx512vl(auVar232._0_16_,auVar232._0_16_);
  auVar34 = vmulps_avx512vl(auVar37,auVar60._0_16_);
  auVar35 = vfmadd231ps_avx512vl(auVar34,auVar38,auVar60._0_16_);
  auVar34 = vfmadd213ps_fma((undefined1  [16])0x0,auVar39,auVar35);
  auVar45._0_4_ = auVar40._0_4_ + auVar34._0_4_;
  auVar45._4_4_ = auVar40._4_4_ + auVar34._4_4_;
  auVar45._8_4_ = auVar40._8_4_ + auVar34._8_4_;
  auVar45._12_4_ = auVar40._12_4_ + auVar34._12_4_;
  auVar44 = auVar242._0_16_;
  auVar34 = vfmadd231ps_avx512vl(auVar35,auVar39,auVar44);
  auVar35 = vfnmadd231ps_avx512vl(auVar34,auVar40,auVar44);
  auVar34 = vmulps_avx512vl(auVar41,auVar60._0_16_);
  auVar36 = vfmadd231ps_avx512vl(auVar34,auVar42,auVar60._0_16_);
  auVar34 = vfmadd213ps_fma(ZEXT816(0) << 0x40,auVar43,auVar36);
  auVar212._0_4_ = auVar33._0_4_ + auVar34._0_4_;
  auVar212._4_4_ = auVar33._4_4_ + auVar34._4_4_;
  auVar212._8_4_ = auVar33._8_4_ + auVar34._8_4_;
  auVar212._12_4_ = auVar33._12_4_ + auVar34._12_4_;
  auVar34 = vfmadd231ps_avx512vl(auVar36,auVar43,auVar44);
  auVar36 = vfnmadd231ps_avx512vl(auVar34,auVar33,auVar44);
  auVar34 = vfmadd213ps_fma(ZEXT816(0) << 0x20,auVar38,auVar37);
  auVar34 = vfmadd231ps_avx512vl(auVar34,auVar39,auVar60._0_16_);
  auVar34 = vfmadd231ps_avx512vl(auVar34,auVar40,auVar60._0_16_);
  auVar37 = vmulps_avx512vl(auVar37,auVar44);
  auVar38 = vfnmadd231ps_avx512vl(auVar37,auVar44,auVar38);
  auVar39 = vfmadd231ps_avx512vl(auVar38,auVar60._0_16_,auVar39);
  auVar38 = vfnmadd231ps_avx512vl(auVar39,auVar60._0_16_,auVar40);
  auVar40 = vfmadd213ps_fma(ZEXT816(0) << 0x20,auVar42,auVar41);
  auVar40 = vfmadd231ps_avx512vl(auVar40,auVar43,auVar60._0_16_);
  auVar40 = vfmadd231ps_avx512vl(auVar40,auVar33,auVar60._0_16_);
  auVar41 = vmulps_avx512vl(auVar41,auVar44);
  auVar42 = vfnmadd231ps_avx512vl(auVar41,auVar44,auVar42);
  auVar43 = vfmadd231ps_avx512vl(auVar42,auVar60._0_16_,auVar43);
  auVar39 = vfnmadd231ps_avx512vl(auVar43,auVar60._0_16_,auVar33);
  auVar33 = vshufps_avx(auVar35,auVar35,0xc9);
  auVar43 = vshufps_avx(auVar212,auVar212,0xc9);
  fVar195 = auVar35._0_4_;
  auVar133._0_4_ = fVar195 * auVar43._0_4_;
  fVar196 = auVar35._4_4_;
  auVar133._4_4_ = fVar196 * auVar43._4_4_;
  fVar197 = auVar35._8_4_;
  auVar133._8_4_ = fVar197 * auVar43._8_4_;
  fVar92 = auVar35._12_4_;
  auVar133._12_4_ = fVar92 * auVar43._12_4_;
  auVar43 = vfmsub231ps_fma(auVar133,auVar33,auVar212);
  auVar42 = vshufps_avx(auVar43,auVar43,0xc9);
  auVar43 = vshufps_avx(auVar36,auVar36,0xc9);
  auVar134._0_4_ = fVar195 * auVar43._0_4_;
  auVar134._4_4_ = fVar196 * auVar43._4_4_;
  auVar134._8_4_ = fVar197 * auVar43._8_4_;
  auVar134._12_4_ = fVar92 * auVar43._12_4_;
  auVar33 = vfmsub231ps_fma(auVar134,auVar33,auVar36);
  auVar41 = vshufps_avx(auVar33,auVar33,0xc9);
  auVar33 = vshufps_avx(auVar38,auVar38,0xc9);
  auVar43 = vshufps_avx(auVar40,auVar40,0xc9);
  fVar111 = auVar38._0_4_;
  auVar124._0_4_ = fVar111 * auVar43._0_4_;
  fVar121 = auVar38._4_4_;
  auVar124._4_4_ = fVar121 * auVar43._4_4_;
  fVar122 = auVar38._8_4_;
  auVar124._8_4_ = fVar122 * auVar43._8_4_;
  fVar123 = auVar38._12_4_;
  auVar124._12_4_ = fVar123 * auVar43._12_4_;
  auVar43 = vfmsub231ps_fma(auVar124,auVar33,auVar40);
  auVar40 = vshufps_avx(auVar43,auVar43,0xc9);
  auVar43 = vshufps_avx(auVar39,auVar39,0xc9);
  auVar164._0_4_ = auVar43._0_4_ * fVar111;
  auVar164._4_4_ = auVar43._4_4_ * fVar121;
  auVar164._8_4_ = auVar43._8_4_ * fVar122;
  auVar164._12_4_ = auVar43._12_4_ * fVar123;
  auVar33 = vfmsub231ps_fma(auVar164,auVar33,auVar39);
  auVar39 = vshufps_avx(auVar33,auVar33,0xc9);
  auVar33 = vdpps_avx(auVar42,auVar42,0x7f);
  fVar198 = auVar33._0_4_;
  auVar59._4_28_ = auVar60._4_28_;
  auVar59._0_4_ = fVar198;
  auVar43 = vrsqrt14ss_avx512f(auVar60._0_16_,auVar59._0_16_);
  auVar37 = vmulss_avx512f(auVar43,ZEXT416(0x3fc00000));
  fVar102 = auVar43._0_4_;
  fVar193 = auVar37._0_4_ - fVar198 * 0.5 * fVar102 * fVar102 * fVar102;
  auVar43 = vdpps_avx(auVar42,auVar41,0x7f);
  fVar211 = fVar193 * auVar42._0_4_;
  fVar218 = fVar193 * auVar42._4_4_;
  fVar219 = fVar193 * auVar42._8_4_;
  fVar220 = fVar193 * auVar42._12_4_;
  auVar174._0_4_ = auVar41._0_4_ * fVar198;
  auVar174._4_4_ = auVar41._4_4_ * fVar198;
  auVar174._8_4_ = auVar41._8_4_ * fVar198;
  auVar174._12_4_ = auVar41._12_4_ * fVar198;
  fVar198 = auVar43._0_4_;
  auVar144._0_4_ = fVar198 * auVar42._0_4_;
  auVar144._4_4_ = fVar198 * auVar42._4_4_;
  auVar144._8_4_ = fVar198 * auVar42._8_4_;
  auVar144._12_4_ = fVar198 * auVar42._12_4_;
  auVar42 = vsubps_avx(auVar174,auVar144);
  auVar43 = vrcp14ss_avx512f(auVar60._0_16_,auVar59._0_16_);
  auVar33 = vfnmadd213ss_fma(auVar33,auVar43,SUB6416(ZEXT464(0x40000000),0));
  fVar198 = auVar43._0_4_ * auVar33._0_4_;
  auVar33 = vdpps_avx(auVar40,auVar40,0x7f);
  fVar102 = auVar33._0_4_;
  auVar62._16_16_ = auVar60._16_16_;
  auVar62._0_16_ = auVar60._0_16_;
  auVar61._4_28_ = auVar62._4_28_;
  auVar61._0_4_ = fVar102;
  auVar43 = vrsqrt14ss_avx512f(auVar60._0_16_,auVar61._0_16_);
  auVar41 = vmulss_avx512f(auVar43,ZEXT416(0x3fc00000));
  fVar194 = auVar43._0_4_;
  fVar194 = auVar41._0_4_ - fVar102 * 0.5 * fVar194 * fVar194 * fVar194;
  auVar43 = vdpps_avx(auVar40,auVar39,0x7f);
  fVar199 = fVar194 * auVar40._0_4_;
  fVar208 = fVar194 * auVar40._4_4_;
  fVar209 = fVar194 * auVar40._8_4_;
  fVar210 = fVar194 * auVar40._12_4_;
  auVar135._0_4_ = fVar102 * auVar39._0_4_;
  auVar135._4_4_ = fVar102 * auVar39._4_4_;
  auVar135._8_4_ = fVar102 * auVar39._8_4_;
  auVar135._12_4_ = fVar102 * auVar39._12_4_;
  fVar102 = auVar43._0_4_;
  auVar125._0_4_ = fVar102 * auVar40._0_4_;
  auVar125._4_4_ = fVar102 * auVar40._4_4_;
  auVar125._8_4_ = fVar102 * auVar40._8_4_;
  auVar125._12_4_ = fVar102 * auVar40._12_4_;
  auVar41 = vsubps_avx(auVar135,auVar125);
  auVar43 = vrcp14ss_avx512f(auVar60._0_16_,auVar61._0_16_);
  auVar33 = vfnmadd213ss_fma(auVar33,auVar43,SUB6416(ZEXT464(0x40000000),0));
  fVar102 = auVar43._0_4_ * auVar33._0_4_;
  auVar33 = vshufps_avx(auVar45,auVar45,0xff);
  auVar150._0_4_ = fVar211 * auVar33._0_4_;
  auVar150._4_4_ = fVar218 * auVar33._4_4_;
  auVar150._8_4_ = fVar219 * auVar33._8_4_;
  auVar150._12_4_ = fVar220 * auVar33._12_4_;
  local_218 = vsubps_avx(auVar45,auVar150);
  auVar43 = vshufps_avx(auVar35,auVar35,0xff);
  auVar136._0_4_ = auVar43._0_4_ * fVar211 + auVar33._0_4_ * fVar193 * auVar42._0_4_ * fVar198;
  auVar136._4_4_ = auVar43._4_4_ * fVar218 + auVar33._4_4_ * fVar193 * auVar42._4_4_ * fVar198;
  auVar136._8_4_ = auVar43._8_4_ * fVar219 + auVar33._8_4_ * fVar193 * auVar42._8_4_ * fVar198;
  auVar136._12_4_ = auVar43._12_4_ * fVar220 + auVar33._12_4_ * fVar193 * auVar42._12_4_ * fVar198;
  auVar42 = vsubps_avx(auVar35,auVar136);
  local_228._0_4_ = auVar45._0_4_ + auVar150._0_4_;
  local_228._4_4_ = auVar45._4_4_ + auVar150._4_4_;
  fStack_220 = auVar45._8_4_ + auVar150._8_4_;
  fStack_21c = auVar45._12_4_ + auVar150._12_4_;
  auVar33 = vshufps_avx(auVar34,auVar34,0xff);
  auVar137._0_4_ = fVar199 * auVar33._0_4_;
  auVar137._4_4_ = fVar208 * auVar33._4_4_;
  auVar137._8_4_ = fVar209 * auVar33._8_4_;
  auVar137._12_4_ = fVar210 * auVar33._12_4_;
  local_238 = vsubps_avx(auVar34,auVar137);
  auVar43 = vshufps_avx(auVar38,auVar38,0xff);
  auVar48._0_4_ = fVar199 * auVar43._0_4_ + auVar33._0_4_ * fVar194 * auVar41._0_4_ * fVar102;
  auVar48._4_4_ = fVar208 * auVar43._4_4_ + auVar33._4_4_ * fVar194 * auVar41._4_4_ * fVar102;
  auVar48._8_4_ = fVar209 * auVar43._8_4_ + auVar33._8_4_ * fVar194 * auVar41._8_4_ * fVar102;
  auVar48._12_4_ = fVar210 * auVar43._12_4_ + auVar33._12_4_ * fVar194 * auVar41._12_4_ * fVar102;
  auVar33 = vsubps_avx(auVar38,auVar48);
  _local_248 = vaddps_avx512vl(auVar34,auVar137);
  auVar46._0_4_ = auVar42._0_4_ * 0.33333334;
  auVar46._4_4_ = auVar42._4_4_ * 0.33333334;
  auVar46._8_4_ = auVar42._8_4_ * 0.33333334;
  auVar46._12_4_ = auVar42._12_4_ * 0.33333334;
  local_258 = vaddps_avx512vl(local_218,auVar46);
  auVar47._0_4_ = auVar33._0_4_ * 0.33333334;
  auVar47._4_4_ = auVar33._4_4_ * 0.33333334;
  auVar47._8_4_ = auVar33._8_4_ * 0.33333334;
  auVar47._12_4_ = auVar33._12_4_ * 0.33333334;
  local_268 = vsubps_avx512vl(local_238,auVar47);
  auVar35._0_4_ = (fVar195 + auVar136._0_4_) * 0.33333334;
  auVar35._4_4_ = (fVar196 + auVar136._4_4_) * 0.33333334;
  auVar35._8_4_ = (fVar197 + auVar136._8_4_) * 0.33333334;
  auVar35._12_4_ = (fVar92 + auVar136._12_4_) * 0.33333334;
  _local_278 = vaddps_avx512vl(_local_228,auVar35);
  auVar36._0_4_ = (fVar111 + auVar48._0_4_) * 0.33333334;
  auVar36._4_4_ = (fVar121 + auVar48._4_4_) * 0.33333334;
  auVar36._8_4_ = (fVar122 + auVar48._8_4_) * 0.33333334;
  auVar36._12_4_ = (fVar123 + auVar48._12_4_) * 0.33333334;
  _local_288 = vsubps_avx512vl(_local_248,auVar36);
  aVar1 = (ray->org).field_0;
  auVar43 = vsubps_avx(local_218,(undefined1  [16])aVar1);
  uVar90 = auVar43._0_4_;
  auVar50._4_4_ = uVar90;
  auVar50._0_4_ = uVar90;
  auVar50._8_4_ = uVar90;
  auVar50._12_4_ = uVar90;
  auVar33 = vshufps_avx(auVar43,auVar43,0x55);
  auVar43 = vshufps_avx(auVar43,auVar43,0xaa);
  aVar2 = (pre->ray_space).vx.field_0;
  aVar3 = (pre->ray_space).vy.field_0;
  fVar198 = (pre->ray_space).vz.field_0.m128[0];
  fVar102 = (pre->ray_space).vz.field_0.m128[1];
  fVar193 = (pre->ray_space).vz.field_0.m128[2];
  fVar194 = (pre->ray_space).vz.field_0.m128[3];
  auVar44._0_4_ = fVar198 * auVar43._0_4_;
  auVar44._4_4_ = fVar102 * auVar43._4_4_;
  auVar44._8_4_ = fVar193 * auVar43._8_4_;
  auVar44._12_4_ = fVar194 * auVar43._12_4_;
  auVar33 = vfmadd231ps_fma(auVar44,(undefined1  [16])aVar3,auVar33);
  auVar40 = vfmadd231ps_fma(auVar33,(undefined1  [16])aVar2,auVar50);
  auVar43 = vsubps_avx512vl(local_258,(undefined1  [16])aVar1);
  uVar90 = auVar43._0_4_;
  auVar49._4_4_ = uVar90;
  auVar49._0_4_ = uVar90;
  auVar49._8_4_ = uVar90;
  auVar49._12_4_ = uVar90;
  auVar33 = vshufps_avx(auVar43,auVar43,0x55);
  auVar43 = vshufps_avx(auVar43,auVar43,0xaa);
  auVar93._0_4_ = fVar198 * auVar43._0_4_;
  auVar93._4_4_ = fVar102 * auVar43._4_4_;
  auVar93._8_4_ = fVar193 * auVar43._8_4_;
  auVar93._12_4_ = fVar194 * auVar43._12_4_;
  auVar33 = vfmadd231ps_fma(auVar93,(undefined1  [16])aVar3,auVar33);
  auVar39 = vfmadd231ps_fma(auVar33,(undefined1  [16])aVar2,auVar49);
  auVar43 = vsubps_avx512vl(local_268,(undefined1  [16])aVar1);
  uVar90 = auVar43._0_4_;
  auVar151._4_4_ = uVar90;
  auVar151._0_4_ = uVar90;
  auVar151._8_4_ = uVar90;
  auVar151._12_4_ = uVar90;
  auVar33 = vshufps_avx(auVar43,auVar43,0x55);
  auVar43 = vshufps_avx(auVar43,auVar43,0xaa);
  auVar103._0_4_ = fVar198 * auVar43._0_4_;
  auVar103._4_4_ = fVar102 * auVar43._4_4_;
  auVar103._8_4_ = fVar193 * auVar43._8_4_;
  auVar103._12_4_ = fVar194 * auVar43._12_4_;
  auVar33 = vfmadd231ps_fma(auVar103,(undefined1  [16])aVar3,auVar33);
  auVar38 = vfmadd231ps_fma(auVar33,(undefined1  [16])aVar2,auVar151);
  auVar43 = vsubps_avx(local_238,(undefined1  [16])aVar1);
  uVar90 = auVar43._0_4_;
  auVar165._4_4_ = uVar90;
  auVar165._0_4_ = uVar90;
  auVar165._8_4_ = uVar90;
  auVar165._12_4_ = uVar90;
  auVar33 = vshufps_avx(auVar43,auVar43,0x55);
  auVar43 = vshufps_avx(auVar43,auVar43,0xaa);
  auVar152._0_4_ = fVar198 * auVar43._0_4_;
  auVar152._4_4_ = fVar102 * auVar43._4_4_;
  auVar152._8_4_ = fVar193 * auVar43._8_4_;
  auVar152._12_4_ = fVar194 * auVar43._12_4_;
  auVar33 = vfmadd231ps_fma(auVar152,(undefined1  [16])aVar3,auVar33);
  auVar37 = vfmadd231ps_fma(auVar33,(undefined1  [16])aVar2,auVar165);
  auVar43 = vsubps_avx(_local_228,(undefined1  [16])aVar1);
  uVar90 = auVar43._0_4_;
  auVar175._4_4_ = uVar90;
  auVar175._0_4_ = uVar90;
  auVar175._8_4_ = uVar90;
  auVar175._12_4_ = uVar90;
  auVar33 = vshufps_avx(auVar43,auVar43,0x55);
  auVar43 = vshufps_avx(auVar43,auVar43,0xaa);
  auVar166._0_4_ = auVar43._0_4_ * fVar198;
  auVar166._4_4_ = auVar43._4_4_ * fVar102;
  auVar166._8_4_ = auVar43._8_4_ * fVar193;
  auVar166._12_4_ = auVar43._12_4_ * fVar194;
  auVar33 = vfmadd231ps_fma(auVar166,(undefined1  [16])aVar3,auVar33);
  auVar34 = vfmadd231ps_fma(auVar33,(undefined1  [16])aVar2,auVar175);
  auVar43 = vsubps_avx512vl(_local_278,(undefined1  [16])aVar1);
  uVar90 = auVar43._0_4_;
  auVar183._4_4_ = uVar90;
  auVar183._0_4_ = uVar90;
  auVar183._8_4_ = uVar90;
  auVar183._12_4_ = uVar90;
  auVar33 = vshufps_avx(auVar43,auVar43,0x55);
  auVar43 = vshufps_avx(auVar43,auVar43,0xaa);
  auVar176._0_4_ = auVar43._0_4_ * fVar198;
  auVar176._4_4_ = auVar43._4_4_ * fVar102;
  auVar176._8_4_ = auVar43._8_4_ * fVar193;
  auVar176._12_4_ = auVar43._12_4_ * fVar194;
  auVar33 = vfmadd231ps_fma(auVar176,(undefined1  [16])aVar3,auVar33);
  auVar35 = vfmadd231ps_fma(auVar33,(undefined1  [16])aVar2,auVar183);
  auVar43 = vsubps_avx512vl(_local_288,(undefined1  [16])aVar1);
  uVar90 = auVar43._0_4_;
  auVar200._4_4_ = uVar90;
  auVar200._0_4_ = uVar90;
  auVar200._8_4_ = uVar90;
  auVar200._12_4_ = uVar90;
  auVar33 = vshufps_avx(auVar43,auVar43,0x55);
  auVar43 = vshufps_avx(auVar43,auVar43,0xaa);
  auVar184._0_4_ = auVar43._0_4_ * fVar198;
  auVar184._4_4_ = auVar43._4_4_ * fVar102;
  auVar184._8_4_ = auVar43._8_4_ * fVar193;
  auVar184._12_4_ = auVar43._12_4_ * fVar194;
  auVar33 = vfmadd231ps_fma(auVar184,(undefined1  [16])aVar3,auVar33);
  auVar36 = vfmadd231ps_fma(auVar33,(undefined1  [16])aVar2,auVar200);
  auVar43 = vsubps_avx512vl(_local_248,(undefined1  [16])aVar1);
  uVar90 = auVar43._0_4_;
  auVar201._4_4_ = uVar90;
  auVar201._0_4_ = uVar90;
  auVar201._8_4_ = uVar90;
  auVar201._12_4_ = uVar90;
  auVar33 = vshufps_avx(auVar43,auVar43,0x55);
  auVar43 = vshufps_avx(auVar43,auVar43,0xaa);
  auVar126._0_4_ = fVar198 * auVar43._0_4_;
  auVar126._4_4_ = fVar102 * auVar43._4_4_;
  auVar126._8_4_ = fVar193 * auVar43._8_4_;
  auVar126._12_4_ = fVar194 * auVar43._12_4_;
  auVar33 = vfmadd231ps_fma(auVar126,(undefined1  [16])aVar3,auVar33);
  auVar44 = vfmadd231ps_fma(auVar33,(undefined1  [16])aVar2,auVar201);
  local_348 = vmovlhps_avx512f(auVar40,auVar34);
  auVar241 = ZEXT1664(local_348);
  local_2e8 = vmovlhps_avx(auVar39,auVar35);
  local_2f8 = vmovlhps_avx512f(auVar38,auVar36);
  _local_1f8 = vmovlhps_avx512f(auVar37,auVar44);
  auVar33 = vminps_avx512vl(local_348,local_2e8);
  auVar42 = vmaxps_avx512vl(local_348,local_2e8);
  auVar43 = vminps_avx512vl(local_2f8,_local_1f8);
  auVar43 = vminps_avx(auVar33,auVar43);
  auVar33 = vmaxps_avx512vl(local_2f8,_local_1f8);
  auVar33 = vmaxps_avx(auVar42,auVar33);
  auVar42 = vshufpd_avx(auVar43,auVar43,3);
  auVar41 = vshufpd_avx(auVar33,auVar33,3);
  auVar43 = vminps_avx(auVar43,auVar42);
  auVar33 = vmaxps_avx(auVar33,auVar41);
  auVar43 = vandps_avx512vl(auVar43,auVar233._0_16_);
  auVar33 = vandps_avx512vl(auVar33,auVar233._0_16_);
  auVar33 = vmaxps_avx(auVar43,auVar33);
  auVar43 = vmovshdup_avx(auVar33);
  auVar33 = vmaxss_avx(auVar43,auVar33);
  local_178._8_8_ = auVar40._0_8_;
  local_178._0_8_ = auVar40._0_8_;
  local_188._8_8_ = auVar39._0_8_;
  local_188._0_8_ = auVar39._0_8_;
  local_198 = vmovddup_avx512vl(auVar38);
  local_1a8._0_8_ = auVar37._0_8_;
  local_1a8._8_8_ = local_1a8._0_8_;
  register0x00001348 = auVar34._0_8_;
  local_1b8 = auVar34._0_8_;
  register0x00001408 = auVar35._0_8_;
  local_1c8 = auVar35._0_8_;
  register0x00001448 = auVar36._0_8_;
  local_1d8 = auVar36._0_8_;
  register0x00001488 = auVar44._0_8_;
  local_1e8 = auVar44._0_8_;
  local_208 = ZEXT416((uint)(auVar33._0_4_ * 9.536743e-07));
  local_78 = vbroadcastss_avx512vl(local_208);
  auVar33 = vxorps_avx512vl(local_78._0_16_,auVar234._0_16_);
  local_98 = vbroadcastss_avx512vl(auVar33);
  local_308 = vsubps_avx512vl(local_2e8,local_348);
  local_318 = vsubps_avx512vl(local_2f8,local_2e8);
  local_e8 = vsubps_avx512vl(_local_1f8,local_2f8);
  local_f8 = vsubps_avx(_local_228,local_218);
  local_108 = vsubps_avx512vl(_local_278,local_258);
  local_118 = vsubps_avx512vl(_local_288,local_268);
  _local_128 = vsubps_avx512vl(_local_248,local_238);
  bVar32 = false;
  auVar33 = ZEXT816(0x3f80000000000000);
  auVar231 = ZEXT1664(auVar33);
  uVar25 = 0;
  do {
    auVar34 = auVar231._0_16_;
    auVar238 = ZEXT1664(auVar34);
    auVar43 = vshufps_avx(auVar34,auVar34,0x50);
    auVar221._8_4_ = 0x3f800000;
    auVar221._0_8_ = &DAT_3f8000003f800000;
    auVar221._12_4_ = 0x3f800000;
    auVar224._16_4_ = 0x3f800000;
    auVar224._0_16_ = auVar221;
    auVar224._20_4_ = 0x3f800000;
    auVar224._24_4_ = 0x3f800000;
    auVar224._28_4_ = 0x3f800000;
    auVar42 = vsubps_avx(auVar221,auVar43);
    fVar198 = auVar43._0_4_;
    auVar112._0_4_ = local_1b8._0_4_ * fVar198;
    fVar102 = auVar43._4_4_;
    auVar112._4_4_ = local_1b8._4_4_ * fVar102;
    fVar193 = auVar43._8_4_;
    auVar112._8_4_ = local_1b8._8_4_ * fVar193;
    fVar194 = auVar43._12_4_;
    auVar112._12_4_ = local_1b8._12_4_ * fVar194;
    auVar127._0_4_ = local_1c8._0_4_ * fVar198;
    auVar127._4_4_ = local_1c8._4_4_ * fVar102;
    auVar127._8_4_ = local_1c8._8_4_ * fVar193;
    auVar127._12_4_ = local_1c8._12_4_ * fVar194;
    auVar138._0_4_ = local_1d8._0_4_ * fVar198;
    auVar138._4_4_ = local_1d8._4_4_ * fVar102;
    auVar138._8_4_ = local_1d8._8_4_ * fVar193;
    auVar138._12_4_ = local_1d8._12_4_ * fVar194;
    auVar94._0_4_ = local_1e8._0_4_ * fVar198;
    auVar94._4_4_ = local_1e8._4_4_ * fVar102;
    auVar94._8_4_ = local_1e8._8_4_ * fVar193;
    auVar94._12_4_ = local_1e8._12_4_ * fVar194;
    auVar41 = vfmadd231ps_fma(auVar112,auVar42,local_178);
    auVar40 = vfmadd231ps_fma(auVar127,auVar42,local_188);
    auVar39 = vfmadd231ps_avx512vl(auVar138,auVar42,local_198);
    auVar42 = vfmadd231ps_fma(auVar94,local_1a8,auVar42);
    auVar43 = vmovshdup_avx(auVar33);
    fVar102 = auVar33._0_4_;
    fVar198 = (auVar43._0_4_ - fVar102) * 0.04761905;
    auVar163._4_4_ = fVar102;
    auVar163._0_4_ = fVar102;
    auVar163._8_4_ = fVar102;
    auVar163._12_4_ = fVar102;
    auVar163._16_4_ = fVar102;
    auVar163._20_4_ = fVar102;
    auVar163._24_4_ = fVar102;
    auVar163._28_4_ = fVar102;
    auVar108._0_8_ = auVar43._0_8_;
    auVar108._8_8_ = auVar108._0_8_;
    auVar108._16_8_ = auVar108._0_8_;
    auVar108._24_8_ = auVar108._0_8_;
    auVar58 = vsubps_avx(auVar108,auVar163);
    uVar90 = auVar41._0_4_;
    auVar109._4_4_ = uVar90;
    auVar109._0_4_ = uVar90;
    auVar109._8_4_ = uVar90;
    auVar109._12_4_ = uVar90;
    auVar109._16_4_ = uVar90;
    auVar109._20_4_ = uVar90;
    auVar109._24_4_ = uVar90;
    auVar109._28_4_ = uVar90;
    auVar180._8_4_ = 1;
    auVar180._0_8_ = 0x100000001;
    auVar180._12_4_ = 1;
    auVar180._16_4_ = 1;
    auVar180._20_4_ = 1;
    auVar180._24_4_ = 1;
    auVar180._28_4_ = 1;
    auVar71 = ZEXT1632(auVar41);
    auVar57 = vpermps_avx2(auVar180,auVar71);
    auVar63 = vbroadcastss_avx512vl(auVar40);
    auVar72 = ZEXT1632(auVar40);
    auVar64 = vpermps_avx512vl(auVar180,auVar72);
    auVar65 = vbroadcastss_avx512vl(auVar39);
    auVar54 = ZEXT1632(auVar39);
    auVar66 = vpermps_avx512vl(auVar180,auVar54);
    auVar67 = vbroadcastss_avx512vl(auVar42);
    auVar68 = ZEXT1632(auVar42);
    auVar55 = vpermps_avx512vl(auVar180,auVar68);
    auVar181._4_4_ = fVar198;
    auVar181._0_4_ = fVar198;
    auVar181._8_4_ = fVar198;
    auVar181._12_4_ = fVar198;
    auVar181._16_4_ = fVar198;
    auVar181._20_4_ = fVar198;
    auVar181._24_4_ = fVar198;
    auVar181._28_4_ = fVar198;
    auVar69 = auVar239._0_32_;
    auVar56 = vpermps_avx512vl(auVar69,auVar71);
    auVar148._8_4_ = 3;
    auVar148._0_8_ = 0x300000003;
    auVar148._12_4_ = 3;
    auVar148._16_4_ = 3;
    auVar148._20_4_ = 3;
    auVar148._24_4_ = 3;
    auVar148._28_4_ = 3;
    auVar51 = vpermps_avx512vl(auVar148,auVar71);
    auVar52 = vpermps_avx512vl(auVar69,auVar72);
    auVar71 = vpermps_avx2(auVar148,auVar72);
    auVar53 = vpermps_avx512vl(auVar69,auVar54);
    auVar72 = vpermps_avx2(auVar148,auVar54);
    auVar54 = vpermps_avx512vl(auVar69,auVar68);
    auVar68 = vpermps_avx512vl(auVar148,auVar68);
    auVar43 = vfmadd132ps_fma(auVar58,auVar163,_DAT_02020f20);
    auVar58 = vsubps_avx(auVar224,ZEXT1632(auVar43));
    auVar69 = vmulps_avx512vl(auVar63,ZEXT1632(auVar43));
    auVar73 = ZEXT1632(auVar43);
    auVar70 = vmulps_avx512vl(auVar64,auVar73);
    auVar42 = vfmadd231ps_fma(auVar69,auVar58,auVar109);
    auVar41 = vfmadd231ps_fma(auVar70,auVar58,auVar57);
    auVar69 = vmulps_avx512vl(auVar65,auVar73);
    auVar70 = vmulps_avx512vl(auVar66,auVar73);
    auVar63 = vfmadd231ps_avx512vl(auVar69,auVar58,auVar63);
    auVar64 = vfmadd231ps_avx512vl(auVar70,auVar58,auVar64);
    auVar69 = vmulps_avx512vl(auVar67,auVar73);
    auVar70 = ZEXT1632(auVar43);
    auVar55 = vmulps_avx512vl(auVar55,auVar70);
    auVar65 = vfmadd231ps_avx512vl(auVar69,auVar58,auVar65);
    auVar66 = vfmadd231ps_avx512vl(auVar55,auVar58,auVar66);
    fVar193 = auVar43._0_4_;
    fVar194 = auVar43._4_4_;
    auVar16._4_4_ = fVar194 * auVar63._4_4_;
    auVar16._0_4_ = fVar193 * auVar63._0_4_;
    fVar195 = auVar43._8_4_;
    auVar16._8_4_ = fVar195 * auVar63._8_4_;
    fVar196 = auVar43._12_4_;
    auVar16._12_4_ = fVar196 * auVar63._12_4_;
    auVar16._16_4_ = auVar63._16_4_ * 0.0;
    auVar16._20_4_ = auVar63._20_4_ * 0.0;
    auVar16._24_4_ = auVar63._24_4_ * 0.0;
    auVar16._28_4_ = fVar102;
    auVar17._4_4_ = fVar194 * auVar64._4_4_;
    auVar17._0_4_ = fVar193 * auVar64._0_4_;
    auVar17._8_4_ = fVar195 * auVar64._8_4_;
    auVar17._12_4_ = fVar196 * auVar64._12_4_;
    auVar17._16_4_ = auVar64._16_4_ * 0.0;
    auVar17._20_4_ = auVar64._20_4_ * 0.0;
    auVar17._24_4_ = auVar64._24_4_ * 0.0;
    auVar17._28_4_ = auVar57._28_4_;
    auVar42 = vfmadd231ps_fma(auVar16,auVar58,ZEXT1632(auVar42));
    auVar41 = vfmadd231ps_fma(auVar17,auVar58,ZEXT1632(auVar41));
    auVar100._0_4_ = fVar193 * auVar65._0_4_;
    auVar100._4_4_ = fVar194 * auVar65._4_4_;
    auVar100._8_4_ = fVar195 * auVar65._8_4_;
    auVar100._12_4_ = fVar196 * auVar65._12_4_;
    auVar100._16_4_ = auVar65._16_4_ * 0.0;
    auVar100._20_4_ = auVar65._20_4_ * 0.0;
    auVar100._24_4_ = auVar65._24_4_ * 0.0;
    auVar100._28_4_ = 0;
    auVar18._4_4_ = fVar194 * auVar66._4_4_;
    auVar18._0_4_ = fVar193 * auVar66._0_4_;
    auVar18._8_4_ = fVar195 * auVar66._8_4_;
    auVar18._12_4_ = fVar196 * auVar66._12_4_;
    auVar18._16_4_ = auVar66._16_4_ * 0.0;
    auVar18._20_4_ = auVar66._20_4_ * 0.0;
    auVar18._24_4_ = auVar66._24_4_ * 0.0;
    auVar18._28_4_ = auVar65._28_4_;
    auVar40 = vfmadd231ps_fma(auVar100,auVar58,auVar63);
    auVar39 = vfmadd231ps_fma(auVar18,auVar58,auVar64);
    auVar19._28_4_ = auVar64._28_4_;
    auVar19._0_28_ =
         ZEXT1628(CONCAT412(fVar196 * auVar39._12_4_,
                            CONCAT48(fVar195 * auVar39._8_4_,
                                     CONCAT44(fVar194 * auVar39._4_4_,fVar193 * auVar39._0_4_))));
    auVar38 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar196 * auVar40._12_4_,
                                                 CONCAT48(fVar195 * auVar40._8_4_,
                                                          CONCAT44(fVar194 * auVar40._4_4_,
                                                                   fVar193 * auVar40._0_4_)))),
                              auVar58,ZEXT1632(auVar42));
    auVar37 = vfmadd231ps_fma(auVar19,auVar58,ZEXT1632(auVar41));
    auVar57 = vsubps_avx(ZEXT1632(auVar40),ZEXT1632(auVar42));
    auVar63 = vsubps_avx(ZEXT1632(auVar39),ZEXT1632(auVar41));
    auVar64 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
    auVar57 = vmulps_avx512vl(auVar57,auVar64);
    auVar63 = vmulps_avx512vl(auVar63,auVar64);
    auVar173._0_4_ = fVar198 * auVar57._0_4_;
    auVar173._4_4_ = fVar198 * auVar57._4_4_;
    auVar173._8_4_ = fVar198 * auVar57._8_4_;
    auVar173._12_4_ = fVar198 * auVar57._12_4_;
    auVar173._16_4_ = fVar198 * auVar57._16_4_;
    auVar173._20_4_ = fVar198 * auVar57._20_4_;
    auVar173._24_4_ = fVar198 * auVar57._24_4_;
    auVar173._28_4_ = 0;
    auVar57 = vmulps_avx512vl(auVar181,auVar63);
    auVar40 = vxorps_avx512vl(auVar67._0_16_,auVar67._0_16_);
    auVar63 = vpermt2ps_avx512vl(ZEXT1632(auVar38),_DAT_0205fd20,ZEXT1632(auVar40));
    auVar65 = vpermt2ps_avx512vl(ZEXT1632(auVar37),_DAT_0205fd20,ZEXT1632(auVar40));
    auVar101._0_4_ = auVar173._0_4_ + auVar38._0_4_;
    auVar101._4_4_ = auVar173._4_4_ + auVar38._4_4_;
    auVar101._8_4_ = auVar173._8_4_ + auVar38._8_4_;
    auVar101._12_4_ = auVar173._12_4_ + auVar38._12_4_;
    auVar101._16_4_ = auVar173._16_4_ + 0.0;
    auVar101._20_4_ = auVar173._20_4_ + 0.0;
    auVar101._24_4_ = auVar173._24_4_ + 0.0;
    auVar101._28_4_ = 0;
    auVar73 = ZEXT1632(auVar40);
    auVar66 = vpermt2ps_avx512vl(auVar173,_DAT_0205fd20,auVar73);
    auVar67 = vaddps_avx512vl(ZEXT1632(auVar37),auVar57);
    auVar55 = vpermt2ps_avx512vl(auVar57,_DAT_0205fd20,auVar73);
    auVar57 = vsubps_avx(auVar63,auVar66);
    auVar66 = vsubps_avx512vl(auVar65,auVar55);
    auVar55 = vmulps_avx512vl(auVar52,auVar70);
    auVar69 = vmulps_avx512vl(auVar71,auVar70);
    auVar55 = vfmadd231ps_avx512vl(auVar55,auVar58,auVar56);
    auVar56 = vfmadd231ps_avx512vl(auVar69,auVar58,auVar51);
    auVar51 = vmulps_avx512vl(auVar53,auVar70);
    auVar69 = vmulps_avx512vl(auVar72,auVar70);
    auVar51 = vfmadd231ps_avx512vl(auVar51,auVar58,auVar52);
    auVar71 = vfmadd231ps_avx512vl(auVar69,auVar58,auVar71);
    auVar52 = vmulps_avx512vl(auVar54,auVar70);
    auVar54 = vmulps_avx512vl(auVar68,auVar70);
    auVar42 = vfmadd231ps_fma(auVar52,auVar58,auVar53);
    auVar41 = vfmadd231ps_fma(auVar54,auVar58,auVar72);
    auVar52 = vmulps_avx512vl(auVar70,auVar51);
    auVar54 = vmulps_avx512vl(ZEXT1632(auVar43),auVar71);
    auVar55 = vfmadd231ps_avx512vl(auVar52,auVar58,auVar55);
    auVar56 = vfmadd231ps_avx512vl(auVar54,auVar58,auVar56);
    auVar51 = vfmadd231ps_avx512vl
                        (ZEXT1632(CONCAT412(fVar196 * auVar42._12_4_,
                                            CONCAT48(fVar195 * auVar42._8_4_,
                                                     CONCAT44(fVar194 * auVar42._4_4_,
                                                              fVar193 * auVar42._0_4_)))),auVar58,
                         auVar51);
    auVar71 = vfmadd231ps_avx512vl
                        (ZEXT1632(CONCAT412(fVar196 * auVar41._12_4_,
                                            CONCAT48(fVar195 * auVar41._8_4_,
                                                     CONCAT44(fVar194 * auVar41._4_4_,
                                                              fVar193 * auVar41._0_4_)))),auVar58,
                         auVar71);
    auVar20._4_4_ = fVar194 * auVar51._4_4_;
    auVar20._0_4_ = fVar193 * auVar51._0_4_;
    auVar20._8_4_ = fVar195 * auVar51._8_4_;
    auVar20._12_4_ = fVar196 * auVar51._12_4_;
    auVar20._16_4_ = auVar51._16_4_ * 0.0;
    auVar20._20_4_ = auVar51._20_4_ * 0.0;
    auVar20._24_4_ = auVar51._24_4_ * 0.0;
    auVar20._28_4_ = auVar72._28_4_;
    auVar21._4_4_ = fVar194 * auVar71._4_4_;
    auVar21._0_4_ = fVar193 * auVar71._0_4_;
    auVar21._8_4_ = fVar195 * auVar71._8_4_;
    auVar21._12_4_ = fVar196 * auVar71._12_4_;
    auVar21._16_4_ = auVar71._16_4_ * 0.0;
    auVar21._20_4_ = auVar71._20_4_ * 0.0;
    auVar21._24_4_ = auVar71._24_4_ * 0.0;
    auVar21._28_4_ = auVar53._28_4_;
    auVar72 = vfmadd231ps_avx512vl(auVar20,auVar58,auVar55);
    auVar52 = vfmadd231ps_avx512vl(auVar21,auVar56,auVar58);
    auVar58 = vsubps_avx512vl(auVar51,auVar55);
    auVar71 = vsubps_avx512vl(auVar71,auVar56);
    auVar58 = vmulps_avx512vl(auVar58,auVar64);
    auVar71 = vmulps_avx512vl(auVar71,auVar64);
    fVar102 = fVar198 * auVar58._0_4_;
    fVar193 = fVar198 * auVar58._4_4_;
    auVar22._4_4_ = fVar193;
    auVar22._0_4_ = fVar102;
    fVar194 = fVar198 * auVar58._8_4_;
    auVar22._8_4_ = fVar194;
    fVar195 = fVar198 * auVar58._12_4_;
    auVar22._12_4_ = fVar195;
    fVar196 = fVar198 * auVar58._16_4_;
    auVar22._16_4_ = fVar196;
    fVar197 = fVar198 * auVar58._20_4_;
    auVar22._20_4_ = fVar197;
    fVar198 = fVar198 * auVar58._24_4_;
    auVar22._24_4_ = fVar198;
    auVar22._28_4_ = auVar58._28_4_;
    auVar71 = vmulps_avx512vl(auVar181,auVar71);
    auVar64 = vpermt2ps_avx512vl(auVar72,_DAT_0205fd20,auVar73);
    auVar55 = vpermt2ps_avx512vl(auVar52,_DAT_0205fd20,auVar73);
    auVar182._0_4_ = auVar72._0_4_ + fVar102;
    auVar182._4_4_ = auVar72._4_4_ + fVar193;
    auVar182._8_4_ = auVar72._8_4_ + fVar194;
    auVar182._12_4_ = auVar72._12_4_ + fVar195;
    auVar182._16_4_ = auVar72._16_4_ + fVar196;
    auVar182._20_4_ = auVar72._20_4_ + fVar197;
    auVar182._24_4_ = auVar72._24_4_ + fVar198;
    auVar182._28_4_ = auVar72._28_4_ + auVar58._28_4_;
    auVar58 = vpermt2ps_avx512vl(auVar22,_DAT_0205fd20,ZEXT1632(auVar40));
    auVar56 = vaddps_avx512vl(auVar52,auVar71);
    auVar71 = vpermt2ps_avx512vl(auVar71,_DAT_0205fd20,ZEXT1632(auVar40));
    auVar58 = vsubps_avx(auVar64,auVar58);
    auVar71 = vsubps_avx512vl(auVar55,auVar71);
    auVar118 = ZEXT1632(auVar38);
    auVar51 = vsubps_avx512vl(auVar72,auVar118);
    auVar131 = ZEXT1632(auVar37);
    auVar53 = vsubps_avx512vl(auVar52,auVar131);
    auVar54 = vsubps_avx512vl(auVar64,auVar63);
    auVar51 = vaddps_avx512vl(auVar51,auVar54);
    auVar54 = vsubps_avx512vl(auVar55,auVar65);
    auVar53 = vaddps_avx512vl(auVar53,auVar54);
    auVar54 = vmulps_avx512vl(auVar131,auVar51);
    auVar54 = vfnmadd231ps_avx512vl(auVar54,auVar118,auVar53);
    auVar68 = vmulps_avx512vl(auVar67,auVar51);
    auVar68 = vfnmadd231ps_avx512vl(auVar68,auVar101,auVar53);
    auVar69 = vmulps_avx512vl(auVar66,auVar51);
    auVar69 = vfnmadd231ps_avx512vl(auVar69,auVar57,auVar53);
    auVar70 = vmulps_avx512vl(auVar65,auVar51);
    auVar70 = vfnmadd231ps_avx512vl(auVar70,auVar63,auVar53);
    auVar73 = vmulps_avx512vl(auVar52,auVar51);
    auVar73 = vfnmadd231ps_avx512vl(auVar73,auVar72,auVar53);
    auVar74 = vmulps_avx512vl(auVar56,auVar51);
    auVar74 = vfnmadd231ps_avx512vl(auVar74,auVar182,auVar53);
    auVar75 = vmulps_avx512vl(auVar71,auVar51);
    auVar75 = vfnmadd231ps_avx512vl(auVar75,auVar58,auVar53);
    auVar51 = vmulps_avx512vl(auVar55,auVar51);
    auVar51 = vfnmadd231ps_avx512vl(auVar51,auVar64,auVar53);
    auVar53 = vminps_avx512vl(auVar54,auVar68);
    auVar54 = vmaxps_avx512vl(auVar54,auVar68);
    auVar68 = vminps_avx512vl(auVar69,auVar70);
    auVar53 = vminps_avx512vl(auVar53,auVar68);
    auVar68 = vmaxps_avx512vl(auVar69,auVar70);
    auVar54 = vmaxps_avx512vl(auVar54,auVar68);
    auVar68 = vminps_avx512vl(auVar73,auVar74);
    auVar69 = vmaxps_avx512vl(auVar73,auVar74);
    auVar70 = vminps_avx512vl(auVar75,auVar51);
    auVar68 = vminps_avx512vl(auVar68,auVar70);
    auVar53 = vminps_avx512vl(auVar53,auVar68);
    auVar51 = vmaxps_avx512vl(auVar75,auVar51);
    auVar51 = vmaxps_avx512vl(auVar69,auVar51);
    auVar51 = vmaxps_avx512vl(auVar54,auVar51);
    uVar11 = vcmpps_avx512vl(auVar53,local_78,2);
    uVar13 = vcmpps_avx512vl(auVar51,local_98,5);
    uVar30 = 0;
    bVar23 = (byte)uVar11 & (byte)uVar13 & 0x7f;
    if (bVar23 != 0) {
      auVar51 = vsubps_avx512vl(auVar63,auVar118);
      auVar53 = vsubps_avx512vl(auVar65,auVar131);
      auVar54 = vsubps_avx512vl(auVar64,auVar72);
      auVar51 = vaddps_avx512vl(auVar51,auVar54);
      auVar54 = vsubps_avx512vl(auVar55,auVar52);
      auVar53 = vaddps_avx512vl(auVar53,auVar54);
      auVar54 = vmulps_avx512vl(auVar131,auVar51);
      auVar54 = vfnmadd231ps_avx512vl(auVar54,auVar53,auVar118);
      auVar67 = vmulps_avx512vl(auVar67,auVar51);
      auVar67 = vfnmadd213ps_avx512vl(auVar101,auVar53,auVar67);
      auVar66 = vmulps_avx512vl(auVar66,auVar51);
      auVar66 = vfnmadd213ps_avx512vl(auVar57,auVar53,auVar66);
      auVar57 = vmulps_avx512vl(auVar65,auVar51);
      auVar65 = vfnmadd231ps_avx512vl(auVar57,auVar53,auVar63);
      auVar57 = vmulps_avx512vl(auVar52,auVar51);
      auVar52 = vfnmadd231ps_avx512vl(auVar57,auVar53,auVar72);
      auVar57 = vmulps_avx512vl(auVar56,auVar51);
      auVar56 = vfnmadd213ps_avx512vl(auVar182,auVar53,auVar57);
      auVar57 = vmulps_avx512vl(auVar71,auVar51);
      auVar68 = vfnmadd213ps_avx512vl(auVar58,auVar53,auVar57);
      auVar58 = vmulps_avx512vl(auVar55,auVar51);
      auVar55 = vfnmadd231ps_avx512vl(auVar58,auVar64,auVar53);
      auVar57 = vminps_avx(auVar54,auVar67);
      auVar58 = vmaxps_avx(auVar54,auVar67);
      auVar63 = vminps_avx(auVar66,auVar65);
      auVar63 = vminps_avx(auVar57,auVar63);
      auVar57 = vmaxps_avx(auVar66,auVar65);
      auVar58 = vmaxps_avx(auVar58,auVar57);
      auVar72 = vminps_avx(auVar52,auVar56);
      auVar57 = vmaxps_avx(auVar52,auVar56);
      auVar64 = vminps_avx(auVar68,auVar55);
      auVar72 = vminps_avx(auVar72,auVar64);
      auVar72 = vminps_avx(auVar63,auVar72);
      auVar63 = vmaxps_avx(auVar68,auVar55);
      auVar57 = vmaxps_avx(auVar57,auVar63);
      auVar58 = vmaxps_avx(auVar58,auVar57);
      uVar11 = vcmpps_avx512vl(auVar58,local_98,5);
      uVar13 = vcmpps_avx512vl(auVar72,local_78,2);
      uVar30 = (uint)(bVar23 & (byte)uVar11 & (byte)uVar13);
    }
    if (uVar30 != 0) {
      auStack_168[uVar25] = uVar30;
      uVar11 = vmovlps_avx(auVar33);
      *(undefined8 *)(&uStack_d8 + uVar25 * 2) = uVar11;
      uVar29 = vmovlps_avx512f(auVar34);
      auStack_58[uVar25] = uVar29;
      uVar25 = (ulong)((int)uVar25 + 1);
    }
    auVar33 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
    auVar233 = ZEXT1664(auVar33);
    auVar33 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
    auVar234 = ZEXT1664(auVar33);
    auVar58 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
    auVar235 = ZEXT3264(auVar58);
    auVar236 = ZEXT464(0x3f800000);
    auVar88._16_16_ = auVar58._16_16_;
    auVar33 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
    auVar237 = ZEXT1664(auVar33);
    auVar33 = vxorps_avx512vl(auVar71._0_16_,auVar71._0_16_);
    auVar232 = ZEXT1664(auVar33);
    auVar240 = ZEXT1664(local_308);
    auVar88._0_16_ = local_318;
    auVar243 = ZEXT1664(local_318);
    do {
      auVar33 = auVar237._0_16_;
      if ((int)uVar25 == 0) {
        if (bVar32) {
          return local_36d;
        }
        fVar198 = ray->tfar;
        auVar15._4_4_ = fVar198;
        auVar15._0_4_ = fVar198;
        auVar15._8_4_ = fVar198;
        auVar15._12_4_ = fVar198;
        auVar15._16_4_ = fVar198;
        auVar15._20_4_ = fVar198;
        auVar15._24_4_ = fVar198;
        auVar15._28_4_ = fVar198;
        uVar11 = vcmpps_avx512vl(local_b8,auVar15,2);
        uVar30 = (uint)uVar31 & (uint)uVar11;
        uVar31 = (ulong)uVar30;
        local_36d = uVar30 != 0;
        if (!local_36d) {
          return local_36d;
        }
        goto LAB_01d29b40;
      }
      uVar24 = (int)uVar25 - 1;
      uVar26 = (ulong)uVar24;
      uVar30 = (&uStack_d8)[uVar26 * 2];
      fVar198 = afStack_d4[uVar26 * 2];
      uVar5 = auStack_168[uVar26];
      auVar225._8_8_ = 0;
      auVar225._0_8_ = auStack_58[uVar26];
      auVar231 = ZEXT1664(auVar225);
      lVar28 = 0;
      for (uVar29 = (ulong)uVar5; (uVar29 & 1) == 0; uVar29 = uVar29 >> 1 | 0x8000000000000000) {
        lVar28 = lVar28 + 1;
      }
      uVar27 = uVar5 - 1 & uVar5;
      auStack_168[uVar26] = uVar27;
      if (uVar27 == 0) {
        uVar25 = (ulong)uVar24;
      }
      auVar42 = vpxord_avx512vl(auVar238._0_16_,auVar238._0_16_);
      auVar43 = vcvtsi2ss_avx512f(auVar42,lVar28);
      auVar41 = vmulss_avx512f(auVar43,SUB6416(ZEXT464(0x3e124925),0));
      lVar28 = lVar28 + 1;
      auVar43 = vpxord_avx512vl(auVar42,auVar42);
      auVar43 = vcvtsi2ss_avx512f(auVar43,lVar28);
      auVar43 = vmulss_avx512f(auVar43,SUB6416(ZEXT464(0x3e124925),0));
      auVar40 = auVar236._0_16_;
      auVar42 = vsubss_avx512f(auVar40,auVar41);
      local_338 = vfmadd231ss_fma(ZEXT416((uint)(fVar198 * auVar41._0_4_)),ZEXT416(uVar30),auVar42);
      auVar42 = vsubss_avx512f(auVar40,auVar43);
      auVar43 = vfmadd231ss_fma(ZEXT416((uint)(fVar198 * auVar43._0_4_)),ZEXT416(uVar30),auVar42);
      fVar102 = auVar43._0_4_;
      fVar193 = local_338._0_4_;
      fVar198 = fVar102 - fVar193;
      vucomiss_avx512f(ZEXT416((uint)fVar198));
      if (uVar5 == 0 || lVar28 == 0) break;
      auVar238 = ZEXT1664(auVar225);
      auVar42 = vshufps_avx(auVar225,auVar225,0x50);
      vucomiss_avx512f(ZEXT416((uint)fVar198));
      auVar38 = vsubps_avx512vl(auVar33,auVar42);
      fVar194 = auVar42._0_4_;
      auVar113._0_4_ = fVar194 * (float)local_1b8._0_4_;
      fVar195 = auVar42._4_4_;
      auVar113._4_4_ = fVar195 * (float)local_1b8._4_4_;
      fVar196 = auVar42._8_4_;
      auVar113._8_4_ = fVar196 * fStack_1b0;
      fVar197 = auVar42._12_4_;
      auVar113._12_4_ = fVar197 * fStack_1ac;
      auVar128._0_4_ = fVar194 * (float)local_1c8._0_4_;
      auVar128._4_4_ = fVar195 * (float)local_1c8._4_4_;
      auVar128._8_4_ = fVar196 * fStack_1c0;
      auVar128._12_4_ = fVar197 * fStack_1bc;
      auVar139._0_4_ = fVar194 * (float)local_1d8._0_4_;
      auVar139._4_4_ = fVar195 * (float)local_1d8._4_4_;
      auVar139._8_4_ = fVar196 * fStack_1d0;
      auVar139._12_4_ = fVar197 * fStack_1cc;
      auVar95._0_4_ = fVar194 * (float)local_1e8._0_4_;
      auVar95._4_4_ = fVar195 * (float)local_1e8._4_4_;
      auVar95._8_4_ = fVar196 * fStack_1e0;
      auVar95._12_4_ = fVar197 * fStack_1dc;
      auVar42 = vfmadd231ps_fma(auVar113,auVar38,local_178);
      auVar41 = vfmadd231ps_fma(auVar128,auVar38,local_188);
      auVar39 = vfmadd231ps_fma(auVar139,auVar38,local_198);
      auVar38 = vfmadd231ps_fma(auVar95,auVar38,local_1a8);
      auVar110._16_16_ = auVar42;
      auVar110._0_16_ = auVar42;
      auVar119._16_16_ = auVar41;
      auVar119._0_16_ = auVar41;
      auVar132._16_16_ = auVar39;
      auVar132._0_16_ = auVar39;
      auVar149._4_4_ = fVar193;
      auVar149._0_4_ = fVar193;
      auVar149._8_4_ = fVar193;
      auVar149._12_4_ = fVar193;
      auVar149._20_4_ = fVar102;
      auVar149._16_4_ = fVar102;
      auVar149._24_4_ = fVar102;
      auVar149._28_4_ = fVar102;
      auVar58 = vsubps_avx(auVar119,auVar110);
      auVar41 = vfmadd213ps_fma(auVar58,auVar149,auVar110);
      auVar58 = vsubps_avx(auVar132,auVar119);
      auVar37 = vfmadd213ps_fma(auVar58,auVar149,auVar119);
      auVar42 = vsubps_avx(auVar38,auVar39);
      auVar120._16_16_ = auVar42;
      auVar120._0_16_ = auVar42;
      auVar42 = vfmadd213ps_fma(auVar120,auVar149,auVar132);
      auVar58 = vsubps_avx(ZEXT1632(auVar37),ZEXT1632(auVar41));
      auVar41 = vfmadd213ps_fma(auVar58,auVar149,ZEXT1632(auVar41));
      auVar58 = vsubps_avx(ZEXT1632(auVar42),ZEXT1632(auVar37));
      auVar42 = vfmadd213ps_fma(auVar58,auVar149,ZEXT1632(auVar37));
      auVar58 = vsubps_avx(ZEXT1632(auVar42),ZEXT1632(auVar41));
      auVar46 = vfmadd231ps_fma(ZEXT1632(auVar41),auVar58,auVar149);
      auVar58 = vmulps_avx512vl(auVar58,auVar235._0_32_);
      auVar77._16_16_ = auVar58._16_16_;
      auVar42 = vmulss_avx512f(ZEXT416((uint)fVar198),SUB6416(ZEXT464(0x3eaaaaab),0));
      fVar102 = auVar42._0_4_;
      auVar140._0_8_ =
           CONCAT44(auVar46._4_4_ + fVar102 * auVar58._4_4_,auVar46._0_4_ + fVar102 * auVar58._0_4_)
      ;
      auVar140._8_4_ = auVar46._8_4_ + fVar102 * auVar58._8_4_;
      auVar140._12_4_ = auVar46._12_4_ + fVar102 * auVar58._12_4_;
      auVar114._0_4_ = fVar102 * auVar58._16_4_;
      auVar114._4_4_ = fVar102 * auVar58._20_4_;
      auVar114._8_4_ = fVar102 * auVar58._24_4_;
      auVar114._12_4_ = fVar102 * auVar58._28_4_;
      auVar50 = vsubps_avx((undefined1  [16])0x0,auVar114);
      auVar35 = vshufpd_avx(auVar46,auVar46,3);
      auVar36 = vshufpd_avx((undefined1  [16])0x0,(undefined1  [16])0x0,3);
      auVar42 = vsubps_avx(auVar35,auVar46);
      auVar41 = vsubps_avx(auVar36,(undefined1  [16])0x0);
      auVar153._0_4_ = auVar41._0_4_ + auVar42._0_4_;
      auVar153._4_4_ = auVar41._4_4_ + auVar42._4_4_;
      auVar153._8_4_ = auVar41._8_4_ + auVar42._8_4_;
      auVar153._12_4_ = auVar41._12_4_ + auVar42._12_4_;
      auVar42 = vshufps_avx(auVar46,auVar46,0xb1);
      auVar41 = vshufps_avx(auVar140,auVar140,0xb1);
      auVar39 = vshufps_avx(auVar50,auVar50,0xb1);
      auVar38 = vshufps_avx((undefined1  [16])0x0,(undefined1  [16])0x0,0xb1);
      auVar213._4_4_ = auVar153._0_4_;
      auVar213._0_4_ = auVar153._0_4_;
      auVar213._8_4_ = auVar153._0_4_;
      auVar213._12_4_ = auVar153._0_4_;
      auVar37 = vshufps_avx(auVar153,auVar153,0x55);
      fVar102 = auVar37._0_4_;
      auVar167._0_4_ = auVar42._0_4_ * fVar102;
      fVar193 = auVar37._4_4_;
      auVar167._4_4_ = auVar42._4_4_ * fVar193;
      fVar194 = auVar37._8_4_;
      auVar167._8_4_ = auVar42._8_4_ * fVar194;
      fVar195 = auVar37._12_4_;
      auVar167._12_4_ = auVar42._12_4_ * fVar195;
      auVar177._0_4_ = auVar41._0_4_ * fVar102;
      auVar177._4_4_ = auVar41._4_4_ * fVar193;
      auVar177._8_4_ = auVar41._8_4_ * fVar194;
      auVar177._12_4_ = auVar41._12_4_ * fVar195;
      auVar185._0_4_ = auVar39._0_4_ * fVar102;
      auVar185._4_4_ = auVar39._4_4_ * fVar193;
      auVar185._8_4_ = auVar39._8_4_ * fVar194;
      auVar185._12_4_ = auVar39._12_4_ * fVar195;
      auVar154._0_4_ = auVar38._0_4_ * fVar102;
      auVar154._4_4_ = auVar38._4_4_ * fVar193;
      auVar154._8_4_ = auVar38._8_4_ * fVar194;
      auVar154._12_4_ = auVar38._12_4_ * fVar195;
      auVar42 = vfmadd231ps_fma(auVar167,auVar213,auVar46);
      auVar41 = vfmadd231ps_fma(auVar177,auVar213,auVar140);
      auVar37 = vfmadd231ps_fma(auVar185,auVar213,auVar50);
      auVar93 = vfmadd231ps_fma(auVar154,(undefined1  [16])0x0,auVar213);
      auVar34 = vshufpd_avx(auVar42,auVar42,1);
      auVar44 = vshufpd_avx(auVar41,auVar41,1);
      auVar45 = vshufpd_avx(auVar37,auVar37,1);
      auVar48 = vshufpd_avx(auVar93,auVar93,1);
      auVar39 = vminss_avx(auVar42,auVar41);
      auVar42 = vmaxss_avx(auVar41,auVar42);
      auVar38 = vminss_avx(auVar37,auVar93);
      auVar41 = vmaxss_avx(auVar93,auVar37);
      auVar38 = vminss_avx(auVar39,auVar38);
      auVar42 = vmaxss_avx(auVar41,auVar42);
      auVar37 = vminss_avx(auVar34,auVar44);
      auVar41 = vmaxss_avx(auVar44,auVar34);
      auVar34 = vminss_avx(auVar45,auVar48);
      auVar39 = vmaxss_avx(auVar48,auVar45);
      auVar37 = vminss_avx(auVar37,auVar34);
      auVar41 = vmaxss_avx(auVar39,auVar41);
      fVar194 = auVar38._0_4_;
      fVar193 = auVar41._0_4_;
      fVar102 = auVar42._0_4_;
      if ((0.0001 <= fVar194) || (fVar193 <= -0.0001)) {
        uVar11 = vcmpps_avx512vl(auVar37,SUB6416(ZEXT464(0x38d1b717),0),1);
        uVar13 = vcmpps_avx512vl(auVar38,SUB6416(ZEXT464(0x38d1b717),0),1);
        if ((-0.0001 < fVar102 & ((byte)uVar13 | (byte)uVar11)) != 0) goto LAB_01d2a9b4;
        uVar11 = vcmpps_avx512vl(SUB6416(ZEXT464(0xb8d1b717),0),auVar41,5);
        uVar13 = vcmpps_avx512vl(auVar37,SUB6416(ZEXT464(0x38d1b717),0),5);
        if ((((ushort)uVar13 | (ushort)uVar11) & 1) == 0) goto LAB_01d2a9b4;
LAB_01d2b5de:
        bVar12 = true;
        auVar88._16_16_ = auVar77._16_16_;
        auVar88._0_16_ = auVar225;
        auVar231 = ZEXT1664(auVar225);
      }
      else {
LAB_01d2a9b4:
        uVar11 = vcmpss_avx512f(auVar38,auVar232._0_16_,1);
        bVar12 = (bool)((byte)uVar11 & 1);
        iVar89 = auVar236._0_4_;
        fVar195 = (float)((uint)bVar12 * -0x40800000 + (uint)!bVar12 * iVar89);
        uVar11 = vcmpss_avx512f(auVar42,ZEXT816(0) << 0x20,1);
        bVar12 = (bool)((byte)uVar11 & 1);
        fVar196 = (float)((uint)bVar12 * -0x40800000 + (uint)!bVar12 * iVar89);
        auVar77._0_16_ = SUB6416(ZEXT464(0x7f800000),0);
        auVar76._4_28_ = auVar77._4_28_;
        auVar76._0_4_ = (uint)(fVar195 == fVar196) * 0x7f800000;
        auVar34 = auVar76._0_16_;
        auVar79._16_16_ = auVar77._16_16_;
        auVar79._0_16_ = SUB6416(ZEXT464(0xff800000),0);
        auVar78._4_28_ = auVar79._4_28_;
        auVar78._0_4_ = (uint)(fVar195 == fVar196) * -0x800000;
        auVar39 = auVar78._0_16_;
        uVar11 = vcmpss_avx512f(auVar37,ZEXT816(0) << 0x20,1);
        bVar12 = (bool)((byte)uVar11 & 1);
        fVar197 = (float)((uint)bVar12 * -0x40800000 + (uint)!bVar12 * iVar89);
        auVar44 = ZEXT416(0xbf800000);
        if ((fVar195 != fVar197) || (NAN(fVar195) || NAN(fVar197))) {
          fVar195 = auVar37._0_4_;
          bVar12 = fVar195 == fVar194;
          if ((!bVar12) || (NAN(fVar195) || NAN(fVar194))) {
            auVar38 = vxorps_avx512vl(auVar38,auVar234._0_16_);
            auVar226._0_4_ = auVar38._0_4_ / (fVar195 - fVar194);
            auVar226._4_12_ = auVar38._4_12_;
            auVar38 = vsubss_avx512f(auVar40,auVar226);
            auVar44 = vxorps_avx512vl(auVar44,auVar44);
            auVar37 = vfmadd213ss_avx512f(auVar38,auVar44,auVar226);
            auVar38 = auVar37;
          }
          else {
            auVar44 = vxorps_avx512vl(auVar44,auVar44);
            vucomiss_avx512f(auVar44);
            auVar81._16_16_ = auVar77._16_16_;
            auVar81._0_16_ = SUB6416(ZEXT464(0x7f800000),0);
            auVar80._4_28_ = auVar81._4_28_;
            auVar80._0_4_ = (uint)bVar12 * auVar44._0_4_ + (uint)!bVar12 * 0x7f800000;
            auVar37 = auVar80._0_16_;
            auVar38 = ZEXT416((uint)bVar12 * 0x3f800000 + (uint)!bVar12 * -0x800000);
          }
          auVar34 = vminss_avx(auVar34,auVar37);
          auVar39 = vmaxss_avx(auVar38,auVar39);
        }
        else {
          auVar44 = vxorps_avx512vl(auVar44,auVar44);
        }
        auVar232 = ZEXT1664(auVar44);
        uVar11 = vcmpss_avx512f(auVar41,auVar44,1);
        bVar12 = (bool)((byte)uVar11 & 1);
        fVar194 = (float)((uint)bVar12 * -0x40800000 + (uint)!bVar12 * iVar89);
        if ((fVar196 != fVar194) || (NAN(fVar196) || NAN(fVar194))) {
          bVar12 = fVar193 == fVar102;
          if ((!bVar12) || (NAN(fVar193) || NAN(fVar102))) {
            auVar42 = vxorps_avx512vl(auVar42,auVar234._0_16_);
            auVar186._0_4_ = auVar42._0_4_ / (fVar193 - fVar102);
            auVar186._4_12_ = auVar42._4_12_;
            auVar42 = vsubss_avx512f(auVar40,auVar186);
            auVar41 = vfmadd213ss_avx512f(auVar42,auVar44,auVar186);
            auVar42 = auVar41;
          }
          else {
            vucomiss_avx512f(auVar44);
            auVar83._16_16_ = auVar77._16_16_;
            auVar83._0_16_ = SUB6416(ZEXT464(0x7f800000),0);
            auVar82._4_28_ = auVar83._4_28_;
            auVar82._0_4_ = (uint)bVar12 * auVar44._0_4_ + (uint)!bVar12 * 0x7f800000;
            auVar41 = auVar82._0_16_;
            auVar42 = ZEXT416((uint)bVar12 * 0x3f800000 + (uint)!bVar12 * -0x800000);
          }
          auVar34 = vminss_avx(auVar34,auVar41);
          auVar39 = vmaxss_avx(auVar42,auVar39);
        }
        bVar12 = fVar197 != fVar194;
        auVar42 = vminss_avx512f(auVar34,auVar40);
        auVar85._16_16_ = auVar77._16_16_;
        auVar85._0_16_ = auVar34;
        auVar84._4_28_ = auVar85._4_28_;
        auVar84._0_4_ = (uint)bVar12 * auVar42._0_4_ + (uint)!bVar12 * auVar34._0_4_;
        auVar42 = vmaxss_avx512f(auVar40,auVar39);
        auVar87._16_16_ = auVar77._16_16_;
        auVar87._0_16_ = auVar39;
        auVar86._4_28_ = auVar87._4_28_;
        auVar86._0_4_ = (uint)bVar12 * auVar42._0_4_ + (uint)!bVar12 * auVar39._0_4_;
        auVar42 = vmaxss_avx512f(auVar44,auVar84._0_16_);
        auVar41 = vminss_avx512f(auVar86._0_16_,auVar40);
        bVar12 = true;
        if (auVar41._0_4_ < auVar42._0_4_) goto LAB_01d2b5de;
        auVar38 = vmaxss_avx512f(auVar44,ZEXT416((uint)(auVar42._0_4_ + -0.1)));
        auVar44 = vminss_avx512f(ZEXT416((uint)(auVar41._0_4_ + 0.1)),auVar40);
        auVar96._0_8_ = auVar46._0_8_;
        auVar96._8_8_ = auVar96._0_8_;
        auVar178._8_8_ = auVar140._0_8_;
        auVar178._0_8_ = auVar140._0_8_;
        auVar187._8_8_ = auVar50._0_8_;
        auVar187._0_8_ = auVar50._0_8_;
        auVar42 = vshufpd_avx(auVar140,auVar140,3);
        auVar41 = vshufpd_avx(auVar50,auVar50,3);
        auVar39 = vshufps_avx(auVar38,auVar44,0);
        auVar45 = vsubps_avx512vl(auVar33,auVar39);
        fVar102 = auVar39._0_4_;
        auVar222._0_4_ = fVar102 * auVar35._0_4_;
        fVar193 = auVar39._4_4_;
        auVar222._4_4_ = fVar193 * auVar35._4_4_;
        fVar194 = auVar39._8_4_;
        auVar222._8_4_ = fVar194 * auVar35._8_4_;
        fVar195 = auVar39._12_4_;
        auVar222._12_4_ = fVar195 * auVar35._12_4_;
        auVar141._0_4_ = fVar102 * auVar42._0_4_;
        auVar141._4_4_ = fVar193 * auVar42._4_4_;
        auVar141._8_4_ = fVar194 * auVar42._8_4_;
        auVar141._12_4_ = fVar195 * auVar42._12_4_;
        auVar145._0_4_ = fVar102 * auVar41._0_4_;
        auVar145._4_4_ = fVar193 * auVar41._4_4_;
        auVar145._8_4_ = fVar194 * auVar41._8_4_;
        auVar145._12_4_ = fVar195 * auVar41._12_4_;
        auVar115._0_4_ = fVar102 * auVar36._0_4_;
        auVar115._4_4_ = fVar193 * auVar36._4_4_;
        auVar115._8_4_ = fVar194 * auVar36._8_4_;
        auVar115._12_4_ = fVar195 * auVar36._12_4_;
        auVar37 = vfmadd231ps_fma(auVar222,auVar45,auVar96);
        auVar34 = vfmadd231ps_fma(auVar141,auVar45,auVar178);
        auVar35 = vfmadd231ps_fma(auVar145,auVar45,auVar187);
        auVar36 = vfmadd231ps_fma(auVar115,auVar45,ZEXT816(0));
        auVar42 = vsubss_avx512f(auVar40,auVar38);
        auVar41 = vmovshdup_avx512vl(auVar225);
        auVar46 = vfmadd231ss_avx512f(ZEXT416((uint)(auVar41._0_4_ * auVar38._0_4_)),auVar225,
                                      auVar42);
        auVar42 = vsubss_avx512f(auVar40,auVar44);
        auVar47 = vfmadd231ss_avx512f(ZEXT416((uint)(auVar44._0_4_ * auVar41._0_4_)),auVar225,
                                      auVar42);
        auVar44 = vdivss_avx512f(auVar40,ZEXT416((uint)fVar198));
        auVar42 = vsubps_avx(auVar34,auVar37);
        auVar103 = auVar242._0_16_;
        auVar39 = vmulps_avx512vl(auVar42,auVar103);
        auVar42 = vsubps_avx(auVar35,auVar34);
        auVar38 = vmulps_avx512vl(auVar42,auVar103);
        auVar42 = vsubps_avx(auVar36,auVar35);
        auVar42 = vmulps_avx512vl(auVar42,auVar103);
        auVar41 = vminps_avx(auVar38,auVar42);
        auVar42 = vmaxps_avx(auVar38,auVar42);
        auVar41 = vminps_avx(auVar39,auVar41);
        auVar42 = vmaxps_avx(auVar39,auVar42);
        auVar39 = vshufpd_avx(auVar41,auVar41,3);
        auVar38 = vshufpd_avx(auVar42,auVar42,3);
        auVar41 = vminps_avx(auVar41,auVar39);
        auVar42 = vmaxps_avx(auVar42,auVar38);
        fVar198 = auVar44._0_4_;
        auVar168._0_4_ = fVar198 * auVar41._0_4_;
        auVar168._4_4_ = fVar198 * auVar41._4_4_;
        auVar168._8_4_ = fVar198 * auVar41._8_4_;
        auVar168._12_4_ = fVar198 * auVar41._12_4_;
        auVar155._0_4_ = fVar198 * auVar42._0_4_;
        auVar155._4_4_ = fVar198 * auVar42._4_4_;
        auVar155._8_4_ = fVar198 * auVar42._8_4_;
        auVar155._12_4_ = fVar198 * auVar42._12_4_;
        auVar44 = vdivss_avx512f(auVar40,ZEXT416((uint)(auVar47._0_4_ - auVar46._0_4_)));
        auVar42 = vshufpd_avx(auVar37,auVar37,3);
        auVar41 = vshufpd_avx(auVar34,auVar34,3);
        auVar39 = vshufpd_avx(auVar35,auVar35,3);
        auVar38 = vshufpd_avx(auVar36,auVar36,3);
        auVar42 = vsubps_avx(auVar42,auVar37);
        auVar37 = vsubps_avx(auVar41,auVar34);
        auVar34 = vsubps_avx(auVar39,auVar35);
        auVar38 = vsubps_avx(auVar38,auVar36);
        auVar41 = vminps_avx(auVar42,auVar37);
        auVar42 = vmaxps_avx(auVar42,auVar37);
        auVar39 = vminps_avx(auVar34,auVar38);
        auVar39 = vminps_avx(auVar41,auVar39);
        auVar41 = vmaxps_avx(auVar34,auVar38);
        auVar42 = vmaxps_avx(auVar42,auVar41);
        fVar198 = auVar44._0_4_;
        auVar188._0_4_ = fVar198 * auVar39._0_4_;
        auVar188._4_4_ = fVar198 * auVar39._4_4_;
        auVar188._8_4_ = fVar198 * auVar39._8_4_;
        auVar188._12_4_ = fVar198 * auVar39._12_4_;
        auVar202._0_4_ = fVar198 * auVar42._0_4_;
        auVar202._4_4_ = fVar198 * auVar42._4_4_;
        auVar202._8_4_ = fVar198 * auVar42._8_4_;
        auVar202._12_4_ = fVar198 * auVar42._12_4_;
        auVar238 = ZEXT1664(local_338);
        auVar93 = vinsertps_avx512f(local_338,auVar46,0x10);
        auVar37 = vinsertps_avx(auVar43,auVar47,0x10);
        auVar91._0_4_ = auVar93._0_4_ + auVar37._0_4_;
        auVar91._4_4_ = auVar93._4_4_ + auVar37._4_4_;
        auVar91._8_4_ = auVar93._8_4_ + auVar37._8_4_;
        auVar91._12_4_ = auVar93._12_4_ + auVar37._12_4_;
        auVar14._8_4_ = 0x3f000000;
        auVar14._0_8_ = 0x3f0000003f000000;
        auVar14._12_4_ = 0x3f000000;
        auVar48 = vmulps_avx512vl(auVar91,auVar14);
        auVar39 = vshufps_avx(auVar48,auVar48,0x54);
        uVar90 = auVar48._0_4_;
        auVar104._4_4_ = uVar90;
        auVar104._0_4_ = uVar90;
        auVar104._8_4_ = uVar90;
        auVar104._12_4_ = uVar90;
        auVar34 = vfmadd213ps_avx512vl(auVar240._0_16_,auVar104,auVar241._0_16_);
        auVar41 = vfmadd213ps_fma(auVar243._0_16_,auVar104,local_2e8);
        auVar38 = vfmadd213ps_fma(local_e8,auVar104,local_2f8);
        auVar42 = vsubps_avx(auVar41,auVar34);
        auVar34 = vfmadd213ps_fma(auVar42,auVar104,auVar34);
        auVar42 = vsubps_avx(auVar38,auVar41);
        auVar42 = vfmadd213ps_fma(auVar42,auVar104,auVar41);
        auVar42 = vsubps_avx(auVar42,auVar34);
        auVar41 = vfmadd231ps_fma(auVar34,auVar42,auVar104);
        auVar35 = vmulps_avx512vl(auVar42,auVar103);
        auVar214._8_8_ = auVar41._0_8_;
        auVar214._0_8_ = auVar41._0_8_;
        auVar42 = vshufpd_avx(auVar41,auVar41,3);
        auVar41 = vshufps_avx(auVar48,auVar48,0x55);
        auVar38 = vsubps_avx(auVar42,auVar214);
        auVar34 = vfmadd231ps_fma(auVar214,auVar41,auVar38);
        auVar227._8_8_ = auVar35._0_8_;
        auVar227._0_8_ = auVar35._0_8_;
        auVar42 = vshufpd_avx(auVar35,auVar35,3);
        auVar42 = vsubps_avx(auVar42,auVar227);
        auVar41 = vfmadd213ps_fma(auVar42,auVar41,auVar227);
        auVar105._0_8_ = auVar38._0_8_ ^ 0x8000000080000000;
        auVar105._8_4_ = auVar38._8_4_ ^ 0x80000000;
        auVar105._12_4_ = auVar38._12_4_ ^ 0x80000000;
        auVar42 = vmovshdup_avx(auVar41);
        auVar228._0_8_ = auVar42._0_8_ ^ 0x8000000080000000;
        auVar228._8_4_ = auVar42._8_4_ ^ 0x80000000;
        auVar228._12_4_ = auVar42._12_4_ ^ 0x80000000;
        auVar35 = vmovshdup_avx512vl(auVar38);
        auVar36 = vpermt2ps_avx512vl(auVar228,ZEXT416(5),auVar38);
        auVar42 = vfmsub231ss_avx512f(ZEXT416((uint)(auVar42._0_4_ * auVar38._0_4_)),auVar41,auVar35
                                     );
        auVar41 = vpermt2ps_avx512vl(auVar41,SUB6416(ZEXT464(4),0),auVar105);
        auVar116._0_4_ = auVar42._0_4_;
        auVar116._4_4_ = auVar116._0_4_;
        auVar116._8_4_ = auVar116._0_4_;
        auVar116._12_4_ = auVar116._0_4_;
        auVar42 = vdivps_avx(auVar36,auVar116);
        auVar41 = vdivps_avx(auVar41,auVar116);
        fVar102 = auVar34._0_4_;
        auVar38 = vshufps_avx(auVar34,auVar34,0x55);
        fVar198 = auVar41._0_4_;
        auVar215._0_4_ = fVar102 * auVar42._0_4_ + auVar38._0_4_ * fVar198;
        auVar215._4_4_ = fVar102 * auVar42._4_4_ + auVar38._4_4_ * auVar41._4_4_;
        auVar215._8_4_ = fVar102 * auVar42._8_4_ + auVar38._8_4_ * auVar41._8_4_;
        auVar215._12_4_ = fVar102 * auVar42._12_4_ + auVar38._12_4_ * auVar41._12_4_;
        auVar50 = vsubps_avx(auVar39,auVar215);
        auVar34 = vmovshdup_avx(auVar42);
        auVar39 = vinsertps_avx(auVar168,auVar188,0x1c);
        auVar229._0_4_ = auVar34._0_4_ * auVar39._0_4_;
        auVar229._4_4_ = auVar34._4_4_ * auVar39._4_4_;
        auVar229._8_4_ = auVar34._8_4_ * auVar39._8_4_;
        auVar229._12_4_ = auVar34._12_4_ * auVar39._12_4_;
        auVar38 = vinsertps_avx(auVar155,auVar202,0x1c);
        auVar216._0_4_ = auVar34._0_4_ * auVar38._0_4_;
        auVar216._4_4_ = auVar34._4_4_ * auVar38._4_4_;
        auVar216._8_4_ = auVar34._8_4_ * auVar38._8_4_;
        auVar216._12_4_ = auVar34._12_4_ * auVar38._12_4_;
        auVar45 = vminps_avx512vl(auVar229,auVar216);
        auVar36 = vmaxps_avx(auVar216,auVar229);
        auVar44 = vmovshdup_avx(auVar41);
        auVar34 = vinsertps_avx(auVar188,auVar168,0x4c);
        auVar189._0_4_ = auVar44._0_4_ * auVar34._0_4_;
        auVar189._4_4_ = auVar44._4_4_ * auVar34._4_4_;
        auVar189._8_4_ = auVar44._8_4_ * auVar34._8_4_;
        auVar189._12_4_ = auVar44._12_4_ * auVar34._12_4_;
        auVar35 = vinsertps_avx(auVar202,auVar155,0x4c);
        auVar203._0_4_ = auVar44._0_4_ * auVar35._0_4_;
        auVar203._4_4_ = auVar44._4_4_ * auVar35._4_4_;
        auVar203._8_4_ = auVar44._8_4_ * auVar35._8_4_;
        auVar203._12_4_ = auVar44._12_4_ * auVar35._12_4_;
        auVar44 = vminps_avx(auVar189,auVar203);
        auVar45 = vaddps_avx512vl(auVar45,auVar44);
        auVar44 = vmaxps_avx(auVar203,auVar189);
        auVar190._0_4_ = auVar36._0_4_ + auVar44._0_4_;
        auVar190._4_4_ = auVar36._4_4_ + auVar44._4_4_;
        auVar190._8_4_ = auVar36._8_4_ + auVar44._8_4_;
        auVar190._12_4_ = auVar36._12_4_ + auVar44._12_4_;
        auVar204._8_8_ = 0x3f80000000000000;
        auVar204._0_8_ = 0x3f80000000000000;
        auVar36 = vsubps_avx(auVar204,auVar190);
        auVar44 = vsubps_avx(auVar204,auVar45);
        auVar45 = vsubps_avx(auVar93,auVar48);
        auVar48 = vsubps_avx(auVar37,auVar48);
        fVar196 = auVar45._0_4_;
        auVar230._0_4_ = fVar196 * auVar36._0_4_;
        fVar197 = auVar45._4_4_;
        auVar230._4_4_ = fVar197 * auVar36._4_4_;
        fVar92 = auVar45._8_4_;
        auVar230._8_4_ = fVar92 * auVar36._8_4_;
        fVar111 = auVar45._12_4_;
        auVar230._12_4_ = fVar111 * auVar36._12_4_;
        auVar49 = vbroadcastss_avx512vl(auVar42);
        auVar39 = vmulps_avx512vl(auVar49,auVar39);
        auVar38 = vmulps_avx512vl(auVar49,auVar38);
        auVar49 = vminps_avx512vl(auVar39,auVar38);
        auVar39 = vmaxps_avx(auVar38,auVar39);
        auVar169._0_4_ = fVar198 * auVar34._0_4_;
        auVar169._4_4_ = fVar198 * auVar34._4_4_;
        auVar169._8_4_ = fVar198 * auVar34._8_4_;
        auVar169._12_4_ = fVar198 * auVar34._12_4_;
        auVar156._0_4_ = fVar198 * auVar35._0_4_;
        auVar156._4_4_ = fVar198 * auVar35._4_4_;
        auVar156._8_4_ = fVar198 * auVar35._8_4_;
        auVar156._12_4_ = fVar198 * auVar35._12_4_;
        auVar38 = vminps_avx(auVar169,auVar156);
        auVar34 = vaddps_avx512vl(auVar49,auVar38);
        auVar35 = vmulps_avx512vl(auVar45,auVar44);
        fVar102 = auVar48._0_4_;
        auVar191._0_4_ = fVar102 * auVar36._0_4_;
        fVar193 = auVar48._4_4_;
        auVar191._4_4_ = fVar193 * auVar36._4_4_;
        fVar194 = auVar48._8_4_;
        auVar191._8_4_ = fVar194 * auVar36._8_4_;
        fVar195 = auVar48._12_4_;
        auVar191._12_4_ = fVar195 * auVar36._12_4_;
        auVar205._0_4_ = fVar102 * auVar44._0_4_;
        auVar205._4_4_ = fVar193 * auVar44._4_4_;
        auVar205._8_4_ = fVar194 * auVar44._8_4_;
        auVar205._12_4_ = fVar195 * auVar44._12_4_;
        auVar38 = vmaxps_avx(auVar156,auVar169);
        auVar157._0_4_ = auVar39._0_4_ + auVar38._0_4_;
        auVar157._4_4_ = auVar39._4_4_ + auVar38._4_4_;
        auVar157._8_4_ = auVar39._8_4_ + auVar38._8_4_;
        auVar157._12_4_ = auVar39._12_4_ + auVar38._12_4_;
        auVar170._8_8_ = 0x3f800000;
        auVar170._0_8_ = 0x3f800000;
        auVar39 = vsubps_avx(auVar170,auVar157);
        auVar38 = vsubps_avx(auVar170,auVar34);
        auVar223._0_4_ = fVar196 * auVar39._0_4_;
        auVar223._4_4_ = fVar197 * auVar39._4_4_;
        auVar223._8_4_ = fVar92 * auVar39._8_4_;
        auVar223._12_4_ = fVar111 * auVar39._12_4_;
        auVar217._0_4_ = fVar196 * auVar38._0_4_;
        auVar217._4_4_ = fVar197 * auVar38._4_4_;
        auVar217._8_4_ = fVar92 * auVar38._8_4_;
        auVar217._12_4_ = fVar111 * auVar38._12_4_;
        auVar158._0_4_ = fVar102 * auVar39._0_4_;
        auVar158._4_4_ = fVar193 * auVar39._4_4_;
        auVar158._8_4_ = fVar194 * auVar39._8_4_;
        auVar158._12_4_ = fVar195 * auVar39._12_4_;
        auVar171._0_4_ = fVar102 * auVar38._0_4_;
        auVar171._4_4_ = fVar193 * auVar38._4_4_;
        auVar171._8_4_ = fVar194 * auVar38._8_4_;
        auVar171._12_4_ = fVar195 * auVar38._12_4_;
        auVar39 = vminps_avx(auVar223,auVar217);
        auVar38 = vminps_avx(auVar158,auVar171);
        auVar34 = vminps_avx(auVar39,auVar38);
        auVar39 = vmaxps_avx(auVar217,auVar223);
        auVar38 = vmaxps_avx(auVar171,auVar158);
        auVar38 = vmaxps_avx(auVar38,auVar39);
        auVar36 = vminps_avx512vl(auVar230,auVar35);
        auVar39 = vminps_avx(auVar191,auVar205);
        auVar39 = vminps_avx(auVar36,auVar39);
        auVar39 = vhaddps_avx(auVar34,auVar39);
        auVar36 = vmaxps_avx512vl(auVar35,auVar230);
        auVar34 = vmaxps_avx(auVar205,auVar191);
        auVar34 = vmaxps_avx(auVar34,auVar36);
        auVar38 = vhaddps_avx(auVar38,auVar34);
        auVar39 = vshufps_avx(auVar39,auVar39,0xe8);
        auVar38 = vshufps_avx(auVar38,auVar38,0xe8);
        auVar159._0_4_ = auVar39._0_4_ + auVar50._0_4_;
        auVar159._4_4_ = auVar39._4_4_ + auVar50._4_4_;
        auVar159._8_4_ = auVar39._8_4_ + auVar50._8_4_;
        auVar159._12_4_ = auVar39._12_4_ + auVar50._12_4_;
        auVar172._0_4_ = auVar38._0_4_ + auVar50._0_4_;
        auVar172._4_4_ = auVar38._4_4_ + auVar50._4_4_;
        auVar172._8_4_ = auVar38._8_4_ + auVar50._8_4_;
        auVar172._12_4_ = auVar38._12_4_ + auVar50._12_4_;
        auVar39 = vmaxps_avx(auVar93,auVar159);
        auVar38 = vminps_avx(auVar172,auVar37);
        uVar29 = vcmpps_avx512vl(auVar38,auVar39,1);
        local_298 = vinsertps_avx(auVar46,auVar47,0x10);
        auVar231 = ZEXT1664(local_298);
        if ((uVar29 & 3) == 0) {
          vucomiss_avx512f(local_338);
          auVar39 = vxorps_avx512vl(auVar35,auVar35);
          auVar232 = ZEXT1664(auVar39);
          auVar88._16_16_ = auVar77._16_16_;
          auVar88._0_16_ = local_348;
          auVar241 = ZEXT1664(local_348);
          if ((uint)uVar25 < 4 && (uVar5 == 0 || lVar28 == 0)) {
            bVar12 = false;
          }
          else {
            lVar28 = 200;
            do {
              auVar38 = vsubss_avx512f(auVar40,auVar50);
              fVar194 = auVar38._0_4_;
              fVar102 = fVar194 * fVar194 * fVar194;
              fVar195 = auVar50._0_4_;
              fVar193 = fVar195 * 3.0 * fVar194 * fVar194;
              fVar194 = fVar194 * fVar195 * fVar195 * 3.0;
              auVar142._4_4_ = fVar102;
              auVar142._0_4_ = fVar102;
              auVar142._8_4_ = fVar102;
              auVar142._12_4_ = fVar102;
              auVar129._4_4_ = fVar193;
              auVar129._0_4_ = fVar193;
              auVar129._8_4_ = fVar193;
              auVar129._12_4_ = fVar193;
              auVar97._4_4_ = fVar194;
              auVar97._0_4_ = fVar194;
              auVar97._8_4_ = fVar194;
              auVar97._12_4_ = fVar194;
              fVar195 = fVar195 * fVar195 * fVar195;
              auVar146._0_4_ = (float)local_1f8._0_4_ * fVar195;
              auVar146._4_4_ = (float)local_1f8._4_4_ * fVar195;
              auVar146._8_4_ = fStack_1f0 * fVar195;
              auVar146._12_4_ = fStack_1ec * fVar195;
              auVar38 = vfmadd231ps_fma(auVar146,local_2f8,auVar97);
              auVar38 = vfmadd231ps_fma(auVar38,local_2e8,auVar129);
              auVar38 = vfmadd231ps_avx512vl(auVar38,local_348,auVar142);
              auVar98._8_8_ = auVar38._0_8_;
              auVar98._0_8_ = auVar38._0_8_;
              auVar38 = vshufpd_avx(auVar38,auVar38,3);
              auVar37 = vshufps_avx(auVar50,auVar50,0x55);
              auVar38 = vsubps_avx(auVar38,auVar98);
              auVar37 = vfmadd213ps_fma(auVar38,auVar37,auVar98);
              fVar102 = auVar37._0_4_;
              auVar38 = vshufps_avx(auVar37,auVar37,0x55);
              auVar99._0_4_ = auVar42._0_4_ * fVar102 + fVar198 * auVar38._0_4_;
              auVar99._4_4_ = auVar42._4_4_ * fVar102 + auVar41._4_4_ * auVar38._4_4_;
              auVar99._8_4_ = auVar42._8_4_ * fVar102 + auVar41._8_4_ * auVar38._8_4_;
              auVar99._12_4_ = auVar42._12_4_ * fVar102 + auVar41._12_4_ * auVar38._12_4_;
              auVar50 = vsubps_avx(auVar50,auVar99);
              auVar38 = vandps_avx512vl(auVar37,auVar233._0_16_);
              auVar88._0_16_ = vprolq_avx512vl(auVar38,0x20);
              auVar38 = vmaxss_avx(auVar88._0_16_,auVar38);
              bVar10 = auVar38._0_4_ <= (float)local_208._0_4_;
              if (auVar38._0_4_ < (float)local_208._0_4_) {
                auVar42 = vucomiss_avx512f(auVar39);
                if (bVar10) {
                  auVar41 = vucomiss_avx512f(auVar42);
                  auVar236 = ZEXT1664(auVar41);
                  if (bVar10) {
                    vmovshdup_avx(auVar42);
                    auVar41 = vucomiss_avx512f(auVar39);
                    if (bVar10) {
                      auVar40 = vucomiss_avx512f(auVar41);
                      auVar236 = ZEXT1664(auVar40);
                      if (bVar10) {
                        auVar38 = vinsertps_avx(ZEXT416((uint)(pre->ray_space).vx.field_0.m128[2]),
                                                ZEXT416((uint)(pre->ray_space).vy.field_0.m128[2]),
                                                0x1c);
                        auVar48 = vinsertps_avx(auVar38,ZEXT416((uint)(pre->ray_space).vz.field_0.
                                                                      m128[2]),0x28);
                        aVar1 = (ray->org).field_0;
                        auVar38 = vsubps_avx(local_218,(undefined1  [16])aVar1);
                        auVar38 = vdpps_avx(auVar38,auVar48,0x7f);
                        auVar37 = vsubps_avx(local_258,(undefined1  [16])aVar1);
                        auVar37 = vdpps_avx(auVar37,auVar48,0x7f);
                        auVar34 = vsubps_avx(local_268,(undefined1  [16])aVar1);
                        auVar34 = vdpps_avx(auVar34,auVar48,0x7f);
                        auVar35 = vsubps_avx(local_238,(undefined1  [16])aVar1);
                        auVar35 = vdpps_avx(auVar35,auVar48,0x7f);
                        auVar36 = vsubps_avx(_local_228,(undefined1  [16])aVar1);
                        auVar36 = vdpps_avx(auVar36,auVar48,0x7f);
                        auVar44 = vsubps_avx(_local_278,(undefined1  [16])aVar1);
                        auVar44 = vdpps_avx(auVar44,auVar48,0x7f);
                        auVar45 = vsubps_avx(_local_288,(undefined1  [16])aVar1);
                        auVar45 = vdpps_avx(auVar45,auVar48,0x7f);
                        auVar50 = vsubps_avx(_local_248,(undefined1  [16])aVar1);
                        auVar48 = vdpps_avx(auVar50,auVar48,0x7f);
                        auVar50 = vsubss_avx512f(auVar40,auVar41);
                        fVar198 = auVar41._0_4_;
                        auVar41 = vfmadd231ss_fma(ZEXT416((uint)(auVar36._0_4_ * fVar198)),auVar50,
                                                  auVar38);
                        auVar38 = vfmadd231ss_fma(ZEXT416((uint)(auVar44._0_4_ * fVar198)),auVar50,
                                                  auVar37);
                        auVar37 = vfmadd231ss_fma(ZEXT416((uint)(auVar45._0_4_ * fVar198)),auVar50,
                                                  auVar34);
                        auVar34 = vfmadd231ss_fma(ZEXT416((uint)(fVar198 * auVar48._0_4_)),auVar50,
                                                  auVar35);
                        auVar88._0_16_ = vsubss_avx512f(auVar40,auVar42);
                        auVar147._0_4_ = auVar88._0_4_;
                        fVar198 = auVar147._0_4_ * auVar147._0_4_ * auVar147._0_4_;
                        fVar194 = auVar42._0_4_;
                        fVar102 = fVar194 * 3.0 * auVar147._0_4_ * auVar147._0_4_;
                        fVar193 = auVar147._0_4_ * fVar194 * fVar194 * 3.0;
                        fVar196 = fVar194 * fVar194 * fVar194;
                        auVar40 = vfmadd231ss_fma(ZEXT416((uint)(fVar196 * auVar34._0_4_)),
                                                  ZEXT416((uint)fVar193),auVar37);
                        auVar40 = vfmadd231ss_fma(auVar40,ZEXT416((uint)fVar102),auVar38);
                        auVar41 = vfmadd231ss_fma(auVar40,ZEXT416((uint)fVar198),auVar41);
                        fVar195 = auVar41._0_4_;
                        if (((ray->org).field_0.m128[3] <= fVar195) &&
                           (fVar197 = ray->tfar, fVar195 <= fVar197)) {
                          auVar41 = vshufps_avx(auVar42,auVar42,0x55);
                          auVar38 = vsubps_avx512vl(auVar33,auVar41);
                          fVar92 = auVar41._0_4_;
                          auVar179._0_4_ = fVar92 * (float)local_228._0_4_;
                          fVar111 = auVar41._4_4_;
                          auVar179._4_4_ = fVar111 * (float)local_228._4_4_;
                          fVar121 = auVar41._8_4_;
                          auVar179._8_4_ = fVar121 * fStack_220;
                          fVar122 = auVar41._12_4_;
                          auVar179._12_4_ = fVar122 * fStack_21c;
                          auVar192._0_4_ = fVar92 * (float)local_278._0_4_;
                          auVar192._4_4_ = fVar111 * (float)local_278._4_4_;
                          auVar192._8_4_ = fVar121 * fStack_270;
                          auVar192._12_4_ = fVar122 * fStack_26c;
                          auVar206._0_4_ = fVar92 * (float)local_288._0_4_;
                          auVar206._4_4_ = fVar111 * (float)local_288._4_4_;
                          auVar206._8_4_ = fVar121 * fStack_280;
                          auVar206._12_4_ = fVar122 * fStack_27c;
                          auVar160._0_4_ = fVar92 * (float)local_248._0_4_;
                          auVar160._4_4_ = fVar111 * (float)local_248._4_4_;
                          auVar160._8_4_ = fVar121 * fStack_240;
                          auVar160._12_4_ = fVar122 * fStack_23c;
                          auVar33 = vfmadd231ps_fma(auVar179,auVar38,local_218);
                          auVar41 = vfmadd231ps_fma(auVar192,auVar38,local_258);
                          auVar40 = vfmadd231ps_fma(auVar206,auVar38,local_268);
                          auVar38 = vfmadd231ps_fma(auVar160,auVar38,local_238);
                          auVar33 = vsubps_avx(auVar41,auVar33);
                          auVar41 = vsubps_avx(auVar40,auVar41);
                          auVar40 = vsubps_avx(auVar38,auVar40);
                          auVar207._0_4_ = fVar194 * auVar41._0_4_;
                          auVar207._4_4_ = fVar194 * auVar41._4_4_;
                          auVar207._8_4_ = fVar194 * auVar41._8_4_;
                          auVar207._12_4_ = fVar194 * auVar41._12_4_;
                          auVar147._4_4_ = auVar147._0_4_;
                          auVar147._8_4_ = auVar147._0_4_;
                          auVar147._12_4_ = auVar147._0_4_;
                          auVar33 = vfmadd231ps_fma(auVar207,auVar147,auVar33);
                          auVar161._0_4_ = fVar194 * auVar40._0_4_;
                          auVar161._4_4_ = fVar194 * auVar40._4_4_;
                          auVar161._8_4_ = fVar194 * auVar40._8_4_;
                          auVar161._12_4_ = fVar194 * auVar40._12_4_;
                          auVar41 = vfmadd231ps_fma(auVar161,auVar147,auVar41);
                          auVar162._0_4_ = fVar194 * auVar41._0_4_;
                          auVar162._4_4_ = fVar194 * auVar41._4_4_;
                          auVar162._8_4_ = fVar194 * auVar41._8_4_;
                          auVar162._12_4_ = fVar194 * auVar41._12_4_;
                          auVar33 = vfmadd231ps_fma(auVar162,auVar147,auVar33);
                          auVar88._0_16_ = vmulps_avx512vl(auVar33,auVar103);
                          pGVar6 = (context->scene->geometries).items[local_320].ptr;
                          if ((pGVar6->mask & ray->mask) == 0) {
                            bVar10 = false;
                          }
                          else if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                                  (bVar10 = true,
                                  pGVar6->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                            auVar143._0_4_ = fVar196 * (float)local_128._0_4_;
                            auVar143._4_4_ = fVar196 * (float)local_128._4_4_;
                            auVar143._8_4_ = fVar196 * fStack_120;
                            auVar143._12_4_ = fVar196 * fStack_11c;
                            auVar130._4_4_ = fVar193;
                            auVar130._0_4_ = fVar193;
                            auVar130._8_4_ = fVar193;
                            auVar130._12_4_ = fVar193;
                            auVar33 = vfmadd132ps_fma(auVar130,auVar143,local_118);
                            auVar117._4_4_ = fVar102;
                            auVar117._0_4_ = fVar102;
                            auVar117._8_4_ = fVar102;
                            auVar117._12_4_ = fVar102;
                            auVar33 = vfmadd132ps_fma(auVar117,auVar33,local_108);
                            auVar106._4_4_ = fVar198;
                            auVar106._0_4_ = fVar198;
                            auVar106._8_4_ = fVar198;
                            auVar106._12_4_ = fVar198;
                            auVar40 = vfmadd132ps_fma(auVar106,auVar33,local_f8);
                            auVar33 = vshufps_avx(auVar40,auVar40,0xc9);
                            auVar41 = vshufps_avx(auVar88._0_16_,auVar88._0_16_,0xc9);
                            auVar107._0_4_ = auVar40._0_4_ * auVar41._0_4_;
                            auVar107._4_4_ = auVar40._4_4_ * auVar41._4_4_;
                            auVar107._8_4_ = auVar40._8_4_ * auVar41._8_4_;
                            auVar107._12_4_ = auVar40._12_4_ * auVar41._12_4_;
                            auVar41 = vfmsub231ps_fma(auVar107,auVar88._0_16_,auVar33);
                            auVar33 = vshufps_avx(auVar41,auVar41,0xe9);
                            local_158 = vmovlps_avx(auVar33);
                            local_150 = auVar41._0_4_;
                            local_14c = vmovlps_avx(auVar42);
                            local_144 = (int)local_2d8;
                            local_140 = (int)local_320;
                            local_13c = context->user->instID[0];
                            local_138 = context->user->instPrimID[0];
                            ray->tfar = fVar195;
                            local_34c = -1;
                            local_2c8.valid = &local_34c;
                            local_2c8.geometryUserPtr = pGVar6->userPtr;
                            local_2c8.context = context->user;
                            local_2c8.hit = (RTCHitN *)&local_158;
                            local_2c8.N = 1;
                            local_2c8.ray = (RTCRayN *)ray;
                            if (pGVar6->occlusionFilterN == (RTCFilterFunctionN)0x0) {
LAB_01d2b4ca:
                              auVar33 = auVar232._0_16_;
                              p_Var7 = context->args->filter;
                              if (p_Var7 != (RTCFilterFunctionN)0x0) {
                                if (((context->args->flags &
                                     RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                                     RTC_RAY_QUERY_FLAG_INCOHERENT) ||
                                   (((pGVar6->field_8).field_0x2 & 0x40) != 0)) {
                                  (*p_Var7)(&local_2c8);
                                  auVar231 = ZEXT1664(local_298);
                                  auVar243 = ZEXT1664(local_318);
                                  auVar240 = ZEXT1664(local_308);
                                  auVar241 = ZEXT1664(local_348);
                                  auVar33 = vxorps_avx512vl(auVar33,auVar33);
                                  auVar232 = ZEXT1664(auVar33);
                                  auVar33 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                                  auVar237 = ZEXT1664(auVar33);
                                  auVar236 = ZEXT464(0x3f800000);
                                  auVar58 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
                                  auVar235 = ZEXT3264(auVar58);
                                  auVar33 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
                                  auVar234 = ZEXT1664(auVar33);
                                  auVar33 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                                  auVar233 = ZEXT1664(auVar33);
                                  auVar33 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
                                  auVar242 = ZEXT1664(auVar33);
                                  auVar88 = vbroadcastss_avx512vl(ZEXT416(2));
                                  auVar239 = ZEXT3264(auVar88);
                                }
                                if (*local_2c8.valid == 0) goto LAB_01d2b5fa;
                              }
                              bVar10 = true;
                            }
                            else {
                              (*pGVar6->occlusionFilterN)(&local_2c8);
                              auVar231 = ZEXT1664(local_298);
                              auVar243 = ZEXT1664(local_318);
                              auVar240 = ZEXT1664(local_308);
                              auVar241 = ZEXT1664(local_348);
                              auVar33 = vxorps_avx512vl(auVar39,auVar39);
                              auVar232 = ZEXT1664(auVar33);
                              auVar33 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                              auVar237 = ZEXT1664(auVar33);
                              auVar236 = ZEXT464(0x3f800000);
                              auVar58 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
                              auVar235 = ZEXT3264(auVar58);
                              auVar33 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
                              auVar234 = ZEXT1664(auVar33);
                              auVar33 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                              auVar233 = ZEXT1664(auVar33);
                              auVar33 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
                              auVar242 = ZEXT1664(auVar33);
                              auVar88 = vbroadcastss_avx512vl(ZEXT416(2));
                              auVar239 = ZEXT3264(auVar88);
                              if (*local_2c8.valid != 0) goto LAB_01d2b4ca;
LAB_01d2b5fa:
                              bVar10 = false;
                            }
                            if (!bVar10) {
                              ray->tfar = fVar197;
                            }
                          }
                          bVar32 = (bool)(bVar32 | bVar10);
                        }
                      }
                    }
                  }
                }
                break;
              }
              lVar28 = lVar28 + -1;
            } while (lVar28 != 0);
          }
        }
        else {
          auVar33 = vxorps_avx512vl(auVar35,auVar35);
          auVar232 = ZEXT1664(auVar33);
          auVar241 = ZEXT1664(local_348);
          auVar88._16_16_ = auVar77._16_16_;
          auVar88._0_16_ = local_338;
        }
      }
    } while (bVar12);
    auVar33 = vinsertps_avx(local_338,auVar43,0x10);
  } while( true );
}

Assistant:

static __forceinline bool occluded_n(const Precalculations& pre, Ray& ray, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);

          unsigned int vertexID = geom->curve(primID);
          Vec3ff a0,a1,a2,a3; Vec3fa n0,n1,n2,n3; geom->gather(a0,a1,a2,a3,n0,n1,n2,n3,vertexID);

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            const unsigned int primID1 = prim.primID(N)[i1];
            geom->prefetchL1_vertices(geom->curve(primID1));
            if (mask1) {
              const size_t i2 = bsf(mask1);
              const unsigned int primID2 = prim.primID(N)[i2];
              geom->prefetchL2_vertices(geom->curve(primID2));
            }
          }

          if (Intersector().intersect(pre,ray,context,geom,primID,a0,a1,a2,a3,n0,n1,n2,n3,Epilog(ray,context,geomID,primID)))
            return true;
          
          mask &= movemask(tNear <= vfloat<M>(ray.tfar));
        }
        return false;
      }